

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_intersector.h
# Opt level: O2

void embree::avx512::CurveNiIntersector1<4>::
     intersect_n<embree::avx512::OrientedCurve1Intersector1<embree::CatmullRomCurveT,7,8>,embree::avx512::Intersect1Epilog1<true>>
               (Precalculations *pre,RayHit *ray,RayQueryContext *context,Primitive *prim)

{
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar1;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar2;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar3;
  uint uVar4;
  uint uVar5;
  Geometry *pGVar6;
  RTCFilterFunctionN p_Var7;
  void *pvVar8;
  __int_type_conflict _Var9;
  undefined8 uVar10;
  undefined8 uVar11;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  bool bVar19;
  byte bVar20;
  uint uVar21;
  ulong uVar22;
  long lVar24;
  uint uVar25;
  ulong uVar26;
  undefined8 unaff_RBP;
  ulong uVar27;
  ulong uVar28;
  bool bVar29;
  bool bVar30;
  bool bVar31;
  bool bVar32;
  bool bVar33;
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 in_YmmResult [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar75 [32];
  undefined1 auVar77 [32];
  undefined1 auVar79 [32];
  undefined1 auVar81 [32];
  undefined1 auVar83 [32];
  undefined4 uVar85;
  vint4 bi_2;
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  vint4 bi_1;
  float fVar100;
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [32];
  float fVar112;
  float fVar120;
  float fVar121;
  vint4 ai_2;
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  float fVar122;
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  vint4 bi;
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [32];
  vint4 ai;
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [32];
  vint4 ai_1;
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [32];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  vfloat4 a0_2;
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [32];
  float fVar188;
  float fVar189;
  float fVar200;
  float fVar202;
  float fVar204;
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  float fVar201;
  float fVar203;
  float fVar205;
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  float fVar206;
  float fVar207;
  float fVar208;
  float fVar209;
  float fVar217;
  float fVar218;
  vfloat4 a0;
  undefined1 auVar210 [16];
  float fVar219;
  undefined1 auVar211 [16];
  undefined1 auVar212 [16];
  undefined1 auVar213 [16];
  undefined1 auVar214 [16];
  undefined1 auVar215 [16];
  undefined1 auVar216 [16];
  vfloat4 a0_1;
  undefined1 auVar220 [16];
  undefined1 auVar221 [16];
  undefined1 auVar222 [16];
  undefined1 auVar223 [16];
  undefined1 auVar224 [16];
  undefined1 auVar225 [16];
  undefined1 auVar226 [16];
  undefined1 auVar227 [16];
  undefined1 auVar228 [16];
  undefined1 auVar230 [16];
  undefined1 auVar231 [16];
  undefined1 auVar232 [16];
  undefined1 auVar233 [16];
  undefined1 auVar234 [16];
  undefined1 in_ZMM17 [64];
  undefined1 auVar235 [64];
  undefined1 auVar236 [64];
  undefined1 auVar237 [64];
  undefined1 auVar238 [64];
  undefined1 auVar239 [64];
  undefined1 auVar240 [64];
  undefined1 auVar241 [64];
  undefined1 auVar242 [64];
  vfloat_impl<4> p00;
  vfloat_impl<4> p02;
  vfloat_impl<4> p01;
  RTCFilterFunctionNArguments args;
  uint mask_stack [4];
  vfloat_impl<4> p03;
  BBox1f cu_stack [4];
  BBox1f cv_stack [4];
  int local_304;
  ulong local_300;
  undefined1 local_2f8 [16];
  undefined1 local_2e8 [8];
  float fStack_2e0;
  float fStack_2dc;
  undefined1 local_2d8 [8];
  float fStack_2d0;
  float fStack_2cc;
  undefined1 local_2c8 [8];
  float fStack_2c0;
  float fStack_2bc;
  undefined1 local_2b8 [8];
  float fStack_2b0;
  float fStack_2ac;
  undefined1 local_2a8 [16];
  undefined1 local_298 [16];
  undefined1 local_288 [16];
  undefined1 local_278 [16];
  undefined1 local_268 [16];
  undefined1 local_258 [16];
  RTCFilterFunctionNArguments local_248;
  undefined1 local_218 [8];
  float fStack_210;
  float fStack_20c;
  undefined1 local_208 [8];
  float fStack_200;
  float fStack_1fc;
  undefined1 local_1f8 [16];
  undefined1 local_1e8 [16];
  undefined1 local_1d8 [8];
  float fStack_1d0;
  float fStack_1cc;
  undefined1 local_1c8 [16];
  undefined1 local_1b8 [8];
  float fStack_1b0;
  float fStack_1ac;
  undefined1 local_1a8 [16];
  uint auStack_198 [4];
  undefined8 local_188;
  float local_180;
  undefined8 local_17c;
  uint local_174;
  uint local_170;
  uint local_16c;
  uint local_168;
  undefined1 local_158 [16];
  undefined1 local_148 [8];
  float fStack_140;
  float fStack_13c;
  undefined1 local_138 [16];
  undefined1 local_128 [16];
  undefined1 local_118 [16];
  undefined1 local_108 [16];
  undefined1 local_f8 [8];
  float fStack_f0;
  float fStack_ec;
  undefined1 local_e8 [16];
  undefined1 local_d8 [16];
  undefined1 local_c8 [16];
  undefined1 local_b8 [32];
  undefined8 uStack_98;
  undefined4 local_78;
  undefined4 uStack_74;
  undefined4 uStack_70;
  undefined4 uStack_6c;
  undefined4 uStack_68;
  undefined4 uStack_64;
  undefined4 uStack_60;
  undefined4 uStack_5c;
  ulong auStack_58 [5];
  ulong uVar23;
  undefined1 auVar74 [32];
  undefined1 auVar76 [32];
  undefined1 auVar78 [32];
  undefined1 auVar80 [32];
  undefined1 auVar82 [32];
  undefined1 auVar84 [32];
  undefined1 auVar229 [32];
  
  uVar22 = (ulong)(byte)prim[1];
  fVar208 = *(float *)(prim + uVar22 * 0x19 + 0x12);
  auVar34 = vsubps_avx((undefined1  [16])(ray->super_RayK<1>).org.field_0,
                       *(undefined1 (*) [16])(prim + uVar22 * 0x19 + 6));
  auVar51._0_4_ = fVar208 * auVar34._0_4_;
  auVar51._4_4_ = fVar208 * auVar34._4_4_;
  auVar51._8_4_ = fVar208 * auVar34._8_4_;
  auVar51._12_4_ = fVar208 * auVar34._12_4_;
  auVar42._0_4_ = fVar208 * (ray->super_RayK<1>).dir.field_0.m128[0];
  auVar42._4_4_ = fVar208 * (ray->super_RayK<1>).dir.field_0.m128[1];
  auVar42._8_4_ = fVar208 * (ray->super_RayK<1>).dir.field_0.m128[2];
  auVar42._12_4_ = fVar208 * (ray->super_RayK<1>).dir.field_0.m128[3];
  auVar34 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar22 * 4 + 6)));
  auVar34 = vcvtdq2ps_avx(auVar34);
  auVar35 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar22 * 5 + 6)));
  auVar36 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar22 * 6 + 6)));
  auVar35 = vcvtdq2ps_avx(auVar35);
  auVar36 = vcvtdq2ps_avx(auVar36);
  auVar37 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar22 * 0xb + 6)));
  auVar37 = vcvtdq2ps_avx(auVar37);
  auVar44 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar22 * 0xc + 6)));
  auVar45 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar22 * 0xd + 6)));
  auVar44 = vcvtdq2ps_avx(auVar44);
  auVar45 = vcvtdq2ps_avx(auVar45);
  auVar43 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar22 * 0x12 + 6)));
  auVar43 = vcvtdq2ps_avx(auVar43);
  auVar49 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar22 * 0x13 + 6)));
  auVar40 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar22 * 0x14 + 6)));
  auVar49 = vcvtdq2ps_avx(auVar49);
  auVar40 = vcvtdq2ps_avx(auVar40);
  auVar220._4_4_ = auVar42._0_4_;
  auVar220._0_4_ = auVar42._0_4_;
  auVar220._8_4_ = auVar42._0_4_;
  auVar220._12_4_ = auVar42._0_4_;
  auVar48 = vshufps_avx(auVar42,auVar42,0x55);
  auVar38 = vshufps_avx(auVar42,auVar42,0xaa);
  fVar208 = auVar38._0_4_;
  auVar123._0_4_ = fVar208 * auVar36._0_4_;
  fVar189 = auVar38._4_4_;
  auVar123._4_4_ = fVar189 * auVar36._4_4_;
  fVar201 = auVar38._8_4_;
  auVar123._8_4_ = fVar201 * auVar36._8_4_;
  fVar203 = auVar38._12_4_;
  auVar123._12_4_ = fVar203 * auVar36._12_4_;
  auVar47._0_4_ = auVar45._0_4_ * fVar208;
  auVar47._4_4_ = auVar45._4_4_ * fVar189;
  auVar47._8_4_ = auVar45._8_4_ * fVar201;
  auVar47._12_4_ = auVar45._12_4_ * fVar203;
  auVar86._0_4_ = auVar40._0_4_ * fVar208;
  auVar86._4_4_ = auVar40._4_4_ * fVar189;
  auVar86._8_4_ = auVar40._8_4_ * fVar201;
  auVar86._12_4_ = auVar40._12_4_ * fVar203;
  auVar38 = vfmadd231ps_fma(auVar123,auVar48,auVar35);
  auVar39 = vfmadd231ps_fma(auVar47,auVar48,auVar44);
  auVar48 = vfmadd231ps_fma(auVar86,auVar49,auVar48);
  auVar41 = vfmadd231ps_fma(auVar38,auVar220,auVar34);
  auVar39 = vfmadd231ps_fma(auVar39,auVar220,auVar37);
  auVar42 = vfmadd231ps_fma(auVar48,auVar43,auVar220);
  auVar221._4_4_ = auVar51._0_4_;
  auVar221._0_4_ = auVar51._0_4_;
  auVar221._8_4_ = auVar51._0_4_;
  auVar221._12_4_ = auVar51._0_4_;
  auVar48 = vshufps_avx(auVar51,auVar51,0x55);
  auVar38 = vshufps_avx(auVar51,auVar51,0xaa);
  fVar208 = auVar38._0_4_;
  auVar230._0_4_ = fVar208 * auVar36._0_4_;
  fVar189 = auVar38._4_4_;
  auVar230._4_4_ = fVar189 * auVar36._4_4_;
  fVar201 = auVar38._8_4_;
  auVar230._8_4_ = fVar201 * auVar36._8_4_;
  fVar203 = auVar38._12_4_;
  auVar230._12_4_ = fVar203 * auVar36._12_4_;
  auVar113._0_4_ = auVar45._0_4_ * fVar208;
  auVar113._4_4_ = auVar45._4_4_ * fVar189;
  auVar113._8_4_ = auVar45._8_4_ * fVar201;
  auVar113._12_4_ = auVar45._12_4_ * fVar203;
  auVar101._0_4_ = auVar40._0_4_ * fVar208;
  auVar101._4_4_ = auVar40._4_4_ * fVar189;
  auVar101._8_4_ = auVar40._8_4_ * fVar201;
  auVar101._12_4_ = auVar40._12_4_ * fVar203;
  auVar35 = vfmadd231ps_fma(auVar230,auVar48,auVar35);
  auVar36 = vfmadd231ps_fma(auVar113,auVar48,auVar44);
  auVar44 = vfmadd231ps_fma(auVar101,auVar48,auVar49);
  auVar49 = vfmadd231ps_fma(auVar35,auVar221,auVar34);
  auVar40 = vfmadd231ps_fma(auVar36,auVar221,auVar37);
  auVar48 = vfmadd231ps_fma(auVar44,auVar221,auVar43);
  auVar69._16_16_ = in_YmmResult._16_16_;
  auVar34 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
  auVar238 = ZEXT1664(auVar34);
  auVar132._8_4_ = 0x219392ef;
  auVar132._0_8_ = 0x219392ef219392ef;
  auVar132._12_4_ = 0x219392ef;
  auVar35 = vandps_avx512vl(auVar41,auVar34);
  uVar27 = vcmpps_avx512vl(auVar35,auVar132,1);
  bVar31 = (bool)((byte)uVar27 & 1);
  auVar38._0_4_ = (uint)bVar31 * 0x219392ef | (uint)!bVar31 * auVar41._0_4_;
  bVar31 = (bool)((byte)(uVar27 >> 1) & 1);
  auVar38._4_4_ = (uint)bVar31 * 0x219392ef | (uint)!bVar31 * auVar41._4_4_;
  bVar31 = (bool)((byte)(uVar27 >> 2) & 1);
  auVar38._8_4_ = (uint)bVar31 * 0x219392ef | (uint)!bVar31 * auVar41._8_4_;
  bVar31 = (bool)((byte)(uVar27 >> 3) & 1);
  auVar38._12_4_ = (uint)bVar31 * 0x219392ef | (uint)!bVar31 * auVar41._12_4_;
  auVar35 = vandps_avx512vl(auVar39,auVar34);
  uVar27 = vcmpps_avx512vl(auVar35,auVar132,1);
  bVar31 = (bool)((byte)uVar27 & 1);
  auVar41._0_4_ = (uint)bVar31 * 0x219392ef | (uint)!bVar31 * auVar39._0_4_;
  bVar31 = (bool)((byte)(uVar27 >> 1) & 1);
  auVar41._4_4_ = (uint)bVar31 * 0x219392ef | (uint)!bVar31 * auVar39._4_4_;
  bVar31 = (bool)((byte)(uVar27 >> 2) & 1);
  auVar41._8_4_ = (uint)bVar31 * 0x219392ef | (uint)!bVar31 * auVar39._8_4_;
  bVar31 = (bool)((byte)(uVar27 >> 3) & 1);
  auVar41._12_4_ = (uint)bVar31 * 0x219392ef | (uint)!bVar31 * auVar39._12_4_;
  auVar34 = vandps_avx512vl(auVar42,auVar34);
  uVar27 = vcmpps_avx512vl(auVar34,auVar132,1);
  bVar31 = (bool)((byte)uVar27 & 1);
  auVar39._0_4_ = (uint)bVar31 * 0x219392ef | (uint)!bVar31 * auVar42._0_4_;
  bVar31 = (bool)((byte)(uVar27 >> 1) & 1);
  auVar39._4_4_ = (uint)bVar31 * 0x219392ef | (uint)!bVar31 * auVar42._4_4_;
  bVar31 = (bool)((byte)(uVar27 >> 2) & 1);
  auVar39._8_4_ = (uint)bVar31 * 0x219392ef | (uint)!bVar31 * auVar42._8_4_;
  bVar31 = (bool)((byte)(uVar27 >> 3) & 1);
  auVar39._12_4_ = (uint)bVar31 * 0x219392ef | (uint)!bVar31 * auVar42._12_4_;
  auVar34 = vrcp14ps_avx512vl(auVar38);
  auVar35 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
  auVar239 = ZEXT1664(auVar35);
  auVar36 = vfnmadd213ps_avx512vl(auVar38,auVar34,auVar35);
  auVar36 = vfmadd132ps_fma(auVar36,auVar34,auVar34);
  auVar34 = vrcp14ps_avx512vl(auVar41);
  auVar37 = vfnmadd213ps_avx512vl(auVar41,auVar34,auVar35);
  auVar45 = vfmadd132ps_fma(auVar37,auVar34,auVar34);
  auVar34 = vrcp14ps_avx512vl(auVar39);
  auVar35 = vfnmadd213ps_avx512vl(auVar39,auVar34,auVar35);
  auVar43 = vfmadd132ps_fma(auVar35,auVar34,auVar34);
  auVar34._8_8_ = 0;
  auVar34._0_8_ = *(ulong *)(prim + uVar22 * 7 + 6);
  auVar34 = vpmovsxwd_avx(auVar34);
  auVar34 = vcvtdq2ps_avx(auVar34);
  auVar34 = vsubps_avx(auVar34,auVar49);
  auVar133._0_4_ = auVar36._0_4_ * auVar34._0_4_;
  auVar133._4_4_ = auVar36._4_4_ * auVar34._4_4_;
  auVar133._8_4_ = auVar36._8_4_ * auVar34._8_4_;
  auVar133._12_4_ = auVar36._12_4_ * auVar34._12_4_;
  auVar35._8_8_ = 0;
  auVar35._0_8_ = *(ulong *)(prim + uVar22 * 9 + 6);
  auVar34 = vpmovsxwd_avx(auVar35);
  auVar34 = vcvtdq2ps_avx(auVar34);
  auVar34 = vsubps_avx(auVar34,auVar49);
  auVar124._0_4_ = auVar36._0_4_ * auVar34._0_4_;
  auVar124._4_4_ = auVar36._4_4_ * auVar34._4_4_;
  auVar124._8_4_ = auVar36._8_4_ * auVar34._8_4_;
  auVar124._12_4_ = auVar36._12_4_ * auVar34._12_4_;
  auVar36._8_8_ = 0;
  auVar36._0_8_ = *(ulong *)(prim + uVar22 * 0xe + 6);
  auVar34 = vpmovsxwd_avx(auVar36);
  auVar34 = vcvtdq2ps_avx(auVar34);
  auVar34 = vsubps_avx(auVar34,auVar40);
  auVar146._0_4_ = auVar45._0_4_ * auVar34._0_4_;
  auVar146._4_4_ = auVar45._4_4_ * auVar34._4_4_;
  auVar146._8_4_ = auVar45._8_4_ * auVar34._8_4_;
  auVar146._12_4_ = auVar45._12_4_ * auVar34._12_4_;
  auVar36 = vpbroadcastd_avx512vl();
  auVar37._8_8_ = 0;
  auVar37._0_8_ = *(ulong *)(prim + (ulong)(byte)prim[1] * 0x10 + 6);
  auVar34 = vpmovsxwd_avx(auVar37);
  auVar34 = vcvtdq2ps_avx(auVar34);
  auVar35 = vsubps_avx(auVar34,auVar40);
  auVar44._8_8_ = 0;
  auVar44._0_8_ = *(ulong *)(prim + uVar22 * 0x15 + 6);
  auVar34 = vpmovsxwd_avx(auVar44);
  auVar50._0_4_ = auVar45._0_4_ * auVar35._0_4_;
  auVar50._4_4_ = auVar45._4_4_ * auVar35._4_4_;
  auVar50._8_4_ = auVar45._8_4_ * auVar35._8_4_;
  auVar50._12_4_ = auVar45._12_4_ * auVar35._12_4_;
  auVar34 = vcvtdq2ps_avx(auVar34);
  auVar34 = vsubps_avx(auVar34,auVar48);
  auVar114._0_4_ = auVar43._0_4_ * auVar34._0_4_;
  auVar114._4_4_ = auVar43._4_4_ * auVar34._4_4_;
  auVar114._8_4_ = auVar43._8_4_ * auVar34._8_4_;
  auVar114._12_4_ = auVar43._12_4_ * auVar34._12_4_;
  auVar45._8_8_ = 0;
  auVar45._0_8_ = *(ulong *)(prim + uVar22 * 0x17 + 6);
  auVar34 = vpmovsxwd_avx(auVar45);
  auVar34 = vcvtdq2ps_avx(auVar34);
  auVar34 = vsubps_avx(auVar34,auVar48);
  auVar46._0_4_ = auVar43._0_4_ * auVar34._0_4_;
  auVar46._4_4_ = auVar43._4_4_ * auVar34._4_4_;
  auVar46._8_4_ = auVar43._8_4_ * auVar34._8_4_;
  auVar46._12_4_ = auVar43._12_4_ * auVar34._12_4_;
  auVar34 = vpminsd_avx(auVar133,auVar124);
  auVar35 = vpminsd_avx(auVar146,auVar50);
  auVar34 = vmaxps_avx(auVar34,auVar35);
  auVar35 = vpminsd_avx(auVar114,auVar46);
  uVar85 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 0xc);
  auVar43._4_4_ = uVar85;
  auVar43._0_4_ = uVar85;
  auVar43._8_4_ = uVar85;
  auVar43._12_4_ = uVar85;
  auVar35 = vmaxps_avx512vl(auVar35,auVar43);
  auVar34 = vmaxps_avx(auVar34,auVar35);
  auVar49._8_4_ = 0x3f7ffffa;
  auVar49._0_8_ = 0x3f7ffffa3f7ffffa;
  auVar49._12_4_ = 0x3f7ffffa;
  local_158 = vmulps_avx512vl(auVar34,auVar49);
  auVar34 = vpmaxsd_avx(auVar133,auVar124);
  auVar35 = vpmaxsd_avx(auVar146,auVar50);
  auVar34 = vminps_avx(auVar34,auVar35);
  auVar35 = vpmaxsd_avx(auVar114,auVar46);
  fVar208 = (ray->super_RayK<1>).tfar;
  auVar40._4_4_ = fVar208;
  auVar40._0_4_ = fVar208;
  auVar40._8_4_ = fVar208;
  auVar40._12_4_ = fVar208;
  auVar35 = vminps_avx512vl(auVar35,auVar40);
  auVar34 = vminps_avx(auVar34,auVar35);
  auVar48._8_4_ = 0x3f800003;
  auVar48._0_8_ = 0x3f8000033f800003;
  auVar48._12_4_ = 0x3f800003;
  auVar34 = vmulps_avx512vl(auVar34,auVar48);
  uVar10 = vcmpps_avx512vl(local_158,auVar34,2);
  uVar11 = vpcmpgtd_avx512vl(auVar36,_DAT_01f4ad30);
  uVar27 = CONCAT44((int)((ulong)unaff_RBP >> 0x20),(uint)((byte)uVar10 & 0xf & (byte)uVar11));
  auVar69._0_16_ = vbroadcastss_avx512vl(ZEXT416(0x80000000));
  auVar241 = ZEXT1664(auVar69._0_16_);
LAB_0180d4fe:
  if (uVar27 == 0) {
    return;
  }
  lVar24 = 0;
  for (uVar22 = uVar27; (uVar22 & 1) == 0; uVar22 = uVar22 >> 1 | 0x8000000000000000) {
    lVar24 = lVar24 + 1;
  }
  uVar4 = *(uint *)(prim + 2);
  pGVar6 = (context->scene->geometries).items[uVar4].ptr;
  local_300 = (ulong)*(uint *)(prim + lVar24 * 4 + 6);
  uVar22 = (ulong)*(uint *)(*(long *)&pGVar6->field_0x58 +
                           pGVar6[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                           _M_i * (ulong)*(uint *)(prim + lVar24 * 4 + 6));
  p_Var7 = pGVar6[1].intersectionFilterN;
  pvVar8 = pGVar6[2].userPtr;
  _Var9 = pGVar6[2].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
  auVar34 = *(undefined1 (*) [16])(_Var9 + uVar22 * (long)pvVar8);
  auVar35 = *(undefined1 (*) [16])(_Var9 + (uVar22 + 1) * (long)pvVar8);
  auVar36 = *(undefined1 (*) [16])(_Var9 + (uVar22 + 2) * (long)pvVar8);
  auVar37 = *(undefined1 (*) [16])(_Var9 + (long)pvVar8 * (uVar22 + 3));
  lVar24 = *(long *)&pGVar6[1].time_range.upper;
  auVar44 = *(undefined1 (*) [16])(lVar24 + (long)p_Var7 * uVar22);
  auVar45 = *(undefined1 (*) [16])(lVar24 + (long)p_Var7 * (uVar22 + 1));
  auVar43 = *(undefined1 (*) [16])(lVar24 + (long)p_Var7 * (uVar22 + 2));
  uVar27 = uVar27 - 1 & uVar27;
  auVar49 = *(undefined1 (*) [16])(lVar24 + (long)p_Var7 * (uVar22 + 3));
  if (uVar27 != 0) {
    uVar28 = uVar27 - 1 & uVar27;
    for (uVar22 = uVar27; (uVar22 & 1) == 0; uVar22 = uVar22 >> 1 | 0x8000000000000000) {
    }
    if (uVar28 != 0) {
      for (; (uVar28 & 1) == 0; uVar28 = uVar28 >> 1 | 0x8000000000000000) {
      }
    }
  }
  auVar52._16_16_ = auVar69._16_16_;
  auVar86 = auVar241._0_16_;
  auVar38 = vmulps_avx512vl(auVar49,auVar86);
  auVar40 = vfmadd213ps_fma(ZEXT816(0) << 0x40,auVar43,auVar38);
  auVar87._0_4_ = auVar45._0_4_ + auVar40._0_4_;
  auVar87._4_4_ = auVar45._4_4_ + auVar40._4_4_;
  auVar87._8_4_ = auVar45._8_4_ + auVar40._8_4_;
  auVar87._12_4_ = auVar45._12_4_ + auVar40._12_4_;
  auVar39 = vfmadd231ps_avx512vl(auVar87,auVar44,auVar86);
  auVar52._0_16_ = vxorps_avx512vl(in_ZMM17._0_16_,in_ZMM17._0_16_);
  auVar40 = vmulps_avx512vl(auVar49,auVar52._0_16_);
  auVar225._8_4_ = 0x3f000000;
  auVar225._0_8_ = 0x3f0000003f000000;
  auVar225._12_4_ = 0x3f000000;
  auVar40 = vfmadd231ps_fma(auVar40,auVar43,auVar225);
  auVar40 = vfmadd231ps_avx512vl(auVar40,auVar45,auVar52._0_16_);
  auVar48 = vfnmadd231ps_fma(auVar40,auVar44,auVar225);
  auVar41 = vmulps_avx512vl(auVar37,auVar86);
  auVar40 = vfmadd213ps_fma(ZEXT816(0) << 0x40,auVar36,auVar41);
  auVar210._0_4_ = auVar40._0_4_ + auVar35._0_4_;
  auVar210._4_4_ = auVar40._4_4_ + auVar35._4_4_;
  auVar210._8_4_ = auVar40._8_4_ + auVar35._8_4_;
  auVar210._12_4_ = auVar40._12_4_ + auVar35._12_4_;
  auVar42 = vfmadd231ps_avx512vl(auVar210,auVar34,auVar86);
  auVar40 = vmulps_avx512vl(auVar37,auVar52._0_16_);
  auVar40 = vfmadd231ps_fma(auVar40,auVar36,auVar225);
  auVar40 = vfmadd231ps_avx512vl(auVar40,auVar35,auVar52._0_16_);
  auVar40 = vfnmadd231ps_fma(auVar40,auVar34,auVar225);
  auVar102._0_4_ = auVar43._0_4_ + auVar38._0_4_;
  auVar102._4_4_ = auVar43._4_4_ + auVar38._4_4_;
  auVar102._8_4_ = auVar43._8_4_ + auVar38._8_4_;
  auVar102._12_4_ = auVar43._12_4_ + auVar38._12_4_;
  auVar38 = vfmadd231ps_avx512vl(auVar102,auVar45,auVar52._0_16_);
  auVar38 = vfmadd231ps_avx512vl(auVar38,auVar44,auVar86);
  auVar115._0_4_ = auVar49._0_4_ * 0.5;
  auVar115._4_4_ = auVar49._4_4_ * 0.5;
  auVar115._8_4_ = auVar49._8_4_ * 0.5;
  auVar115._12_4_ = auVar49._12_4_ * 0.5;
  auVar43 = vfmadd231ps_avx512vl(auVar115,auVar52._0_16_,auVar43);
  auVar45 = vfnmadd231ps_fma(auVar43,auVar225,auVar45);
  auVar43 = vfmadd231ps_avx512vl(auVar45,auVar52._0_16_,auVar44);
  auVar164._0_4_ = auVar41._0_4_ + auVar36._0_4_;
  auVar164._4_4_ = auVar41._4_4_ + auVar36._4_4_;
  auVar164._8_4_ = auVar41._8_4_ + auVar36._8_4_;
  auVar164._12_4_ = auVar41._12_4_ + auVar36._12_4_;
  auVar44 = vfmadd231ps_avx512vl(auVar164,auVar35,auVar52._0_16_);
  auVar44 = vfmadd231ps_avx512vl(auVar44,auVar34,auVar86);
  auVar154._0_4_ = auVar37._0_4_ * 0.5;
  auVar154._4_4_ = auVar37._4_4_ * 0.5;
  auVar154._8_4_ = auVar37._8_4_ * 0.5;
  auVar154._12_4_ = auVar37._12_4_ * 0.5;
  auVar36 = vfmadd231ps_avx512vl(auVar154,auVar52._0_16_,auVar36);
  auVar35 = vfnmadd231ps_fma(auVar36,auVar225,auVar35);
  auVar45 = vfmadd231ps_avx512vl(auVar35,auVar52._0_16_,auVar34);
  auVar34 = vshufps_avx(auVar48,auVar48,0xc9);
  auVar35 = vshufps_avx(auVar42,auVar42,0xc9);
  fVar205 = auVar48._0_4_;
  auVar134._0_4_ = fVar205 * auVar35._0_4_;
  fVar206 = auVar48._4_4_;
  auVar134._4_4_ = fVar206 * auVar35._4_4_;
  fVar207 = auVar48._8_4_;
  auVar134._8_4_ = fVar207 * auVar35._8_4_;
  fVar100 = auVar48._12_4_;
  auVar134._12_4_ = fVar100 * auVar35._12_4_;
  auVar35 = vfmsub231ps_fma(auVar134,auVar34,auVar42);
  auVar36 = vshufps_avx(auVar35,auVar35,0xc9);
  auVar35 = vshufps_avx(auVar40,auVar40,0xc9);
  auVar135._0_4_ = fVar205 * auVar35._0_4_;
  auVar135._4_4_ = fVar206 * auVar35._4_4_;
  auVar135._8_4_ = fVar207 * auVar35._8_4_;
  auVar135._12_4_ = fVar100 * auVar35._12_4_;
  auVar34 = vfmsub231ps_fma(auVar135,auVar34,auVar40);
  auVar37 = vshufps_avx(auVar34,auVar34,0xc9);
  auVar34 = vshufps_avx(auVar43,auVar43,0xc9);
  auVar35 = vshufps_avx(auVar44,auVar44,0xc9);
  fVar112 = auVar43._0_4_;
  auVar125._0_4_ = fVar112 * auVar35._0_4_;
  fVar120 = auVar43._4_4_;
  auVar125._4_4_ = fVar120 * auVar35._4_4_;
  fVar121 = auVar43._8_4_;
  auVar125._8_4_ = fVar121 * auVar35._8_4_;
  fVar122 = auVar43._12_4_;
  auVar125._12_4_ = fVar122 * auVar35._12_4_;
  auVar35 = vfmsub231ps_fma(auVar125,auVar34,auVar44);
  auVar44 = vshufps_avx(auVar35,auVar35,0xc9);
  auVar35 = vshufps_avx(auVar45,auVar45,0xc9);
  auVar165._0_4_ = auVar35._0_4_ * fVar112;
  auVar165._4_4_ = auVar35._4_4_ * fVar120;
  auVar165._8_4_ = auVar35._8_4_ * fVar121;
  auVar165._12_4_ = auVar35._12_4_ * fVar122;
  auVar35 = vfmsub231ps_fma(auVar165,auVar34,auVar45);
  auVar34 = vdpps_avx(auVar36,auVar36,0x7f);
  auVar45 = vshufps_avx(auVar35,auVar35,0xc9);
  fVar189 = auVar34._0_4_;
  auVar67._4_28_ = auVar52._4_28_;
  auVar67._0_4_ = fVar189;
  auVar35 = vrsqrt14ss_avx512f(auVar52._0_16_,auVar67._0_16_);
  fVar208 = auVar35._0_4_;
  auVar35 = vdpps_avx(auVar36,auVar37,0x7f);
  fVar208 = fVar208 * 1.5 + fVar189 * -0.5 * fVar208 * fVar208 * fVar208;
  fVar188 = fVar208 * auVar36._0_4_;
  fVar200 = fVar208 * auVar36._4_4_;
  fVar202 = fVar208 * auVar36._8_4_;
  fVar204 = fVar208 * auVar36._12_4_;
  auVar172._0_4_ = auVar37._0_4_ * fVar189;
  auVar172._4_4_ = auVar37._4_4_ * fVar189;
  auVar172._8_4_ = auVar37._8_4_ * fVar189;
  auVar172._12_4_ = auVar37._12_4_ * fVar189;
  fVar189 = auVar35._0_4_;
  auVar147._0_4_ = fVar189 * auVar36._0_4_;
  auVar147._4_4_ = fVar189 * auVar36._4_4_;
  auVar147._8_4_ = fVar189 * auVar36._8_4_;
  auVar147._12_4_ = fVar189 * auVar36._12_4_;
  auVar36 = vsubps_avx(auVar172,auVar147);
  auVar35 = vrcp14ss_avx512f(auVar52._0_16_,auVar67._0_16_);
  auVar34 = vfnmadd213ss_avx512f(auVar34,auVar35,ZEXT416(0x40000000));
  fVar201 = auVar35._0_4_ * auVar34._0_4_;
  auVar34 = vdpps_avx(auVar44,auVar44,0x7f);
  fVar203 = auVar34._0_4_;
  auVar68._16_16_ = auVar52._16_16_;
  auVar68._0_16_ = auVar52._0_16_;
  auVar53._4_28_ = auVar68._4_28_;
  auVar53._0_4_ = fVar203;
  auVar35 = vrsqrt14ss_avx512f(auVar52._0_16_,auVar53._0_16_);
  fVar189 = auVar35._0_4_;
  fVar189 = fVar189 * 1.5 + fVar203 * -0.5 * fVar189 * fVar189 * fVar189;
  auVar35 = vdpps_avx(auVar44,auVar45,0x7f);
  fVar209 = fVar189 * auVar44._0_4_;
  fVar217 = fVar189 * auVar44._4_4_;
  fVar218 = fVar189 * auVar44._8_4_;
  fVar219 = fVar189 * auVar44._12_4_;
  auVar136._0_4_ = fVar203 * auVar45._0_4_;
  auVar136._4_4_ = fVar203 * auVar45._4_4_;
  auVar136._8_4_ = fVar203 * auVar45._8_4_;
  auVar136._12_4_ = fVar203 * auVar45._12_4_;
  fVar203 = auVar35._0_4_;
  auVar126._0_4_ = fVar203 * auVar44._0_4_;
  auVar126._4_4_ = fVar203 * auVar44._4_4_;
  auVar126._8_4_ = fVar203 * auVar44._8_4_;
  auVar126._12_4_ = fVar203 * auVar44._12_4_;
  auVar37 = vsubps_avx(auVar136,auVar126);
  auVar35 = vrcp14ss_avx512f(auVar52._0_16_,auVar53._0_16_);
  auVar34 = vfnmadd213ss_avx512f(auVar34,auVar35,ZEXT416(0x40000000));
  fVar203 = auVar35._0_4_ * auVar34._0_4_;
  auVar34 = vshufps_avx(auVar39,auVar39,0xff);
  auVar155._0_4_ = fVar188 * auVar34._0_4_;
  auVar155._4_4_ = fVar200 * auVar34._4_4_;
  auVar155._8_4_ = fVar202 * auVar34._8_4_;
  auVar155._12_4_ = fVar204 * auVar34._12_4_;
  local_1a8 = vsubps_avx(auVar39,auVar155);
  auVar35 = vshufps_avx(auVar48,auVar48,0xff);
  auVar137._0_4_ = auVar35._0_4_ * fVar188 + auVar34._0_4_ * fVar208 * auVar36._0_4_ * fVar201;
  auVar137._4_4_ = auVar35._4_4_ * fVar200 + auVar34._4_4_ * fVar208 * auVar36._4_4_ * fVar201;
  auVar137._8_4_ = auVar35._8_4_ * fVar202 + auVar34._8_4_ * fVar208 * auVar36._8_4_ * fVar201;
  auVar137._12_4_ = auVar35._12_4_ * fVar204 + auVar34._12_4_ * fVar208 * auVar36._12_4_ * fVar201;
  auVar36 = vsubps_avx(auVar48,auVar137);
  local_1b8._0_4_ = auVar39._0_4_ + auVar155._0_4_;
  local_1b8._4_4_ = auVar39._4_4_ + auVar155._4_4_;
  fStack_1b0 = auVar39._8_4_ + auVar155._8_4_;
  fStack_1ac = auVar39._12_4_ + auVar155._12_4_;
  auVar34 = vshufps_avx(auVar38,auVar38,0xff);
  auVar138._0_4_ = fVar209 * auVar34._0_4_;
  auVar138._4_4_ = fVar217 * auVar34._4_4_;
  auVar138._8_4_ = fVar218 * auVar34._8_4_;
  auVar138._12_4_ = fVar219 * auVar34._12_4_;
  local_1c8 = vsubps_avx(auVar38,auVar138);
  auVar35 = vshufps_avx(auVar43,auVar43,0xff);
  auVar95._0_4_ = fVar209 * auVar35._0_4_ + auVar34._0_4_ * fVar189 * auVar37._0_4_ * fVar203;
  auVar95._4_4_ = fVar217 * auVar35._4_4_ + auVar34._4_4_ * fVar189 * auVar37._4_4_ * fVar203;
  auVar95._8_4_ = fVar218 * auVar35._8_4_ + auVar34._8_4_ * fVar189 * auVar37._8_4_ * fVar203;
  auVar95._12_4_ = fVar219 * auVar35._12_4_ + auVar34._12_4_ * fVar189 * auVar37._12_4_ * fVar203;
  auVar34 = vsubps_avx(auVar43,auVar95);
  _local_1d8 = vaddps_avx512vl(auVar38,auVar138);
  auVar103._0_4_ = auVar36._0_4_ * 0.33333334;
  auVar103._4_4_ = auVar36._4_4_ * 0.33333334;
  auVar103._8_4_ = auVar36._8_4_ * 0.33333334;
  auVar103._12_4_ = auVar36._12_4_ * 0.33333334;
  local_1e8 = vaddps_avx512vl(local_1a8,auVar103);
  auVar104._0_4_ = auVar34._0_4_ * 0.33333334;
  auVar104._4_4_ = auVar34._4_4_ * 0.33333334;
  auVar104._8_4_ = auVar34._8_4_ * 0.33333334;
  auVar104._12_4_ = auVar34._12_4_ * 0.33333334;
  local_1f8 = vsubps_avx512vl(local_1c8,auVar104);
  auVar88._0_4_ = (fVar205 + auVar137._0_4_) * 0.33333334;
  auVar88._4_4_ = (fVar206 + auVar137._4_4_) * 0.33333334;
  auVar88._8_4_ = (fVar207 + auVar137._8_4_) * 0.33333334;
  auVar88._12_4_ = (fVar100 + auVar137._12_4_) * 0.33333334;
  _local_208 = vaddps_avx512vl(_local_1b8,auVar88);
  auVar89._0_4_ = (fVar112 + auVar95._0_4_) * 0.33333334;
  auVar89._4_4_ = (fVar120 + auVar95._4_4_) * 0.33333334;
  auVar89._8_4_ = (fVar121 + auVar95._8_4_) * 0.33333334;
  auVar89._12_4_ = (fVar122 + auVar95._12_4_) * 0.33333334;
  aVar1 = (ray->super_RayK<1>).org.field_0;
  _local_218 = vsubps_avx512vl(_local_1d8,auVar89);
  auVar35 = vsubps_avx(local_1a8,(undefined1  [16])aVar1);
  uVar85 = auVar35._0_4_;
  auVar96._4_4_ = uVar85;
  auVar96._0_4_ = uVar85;
  auVar96._8_4_ = uVar85;
  auVar96._12_4_ = uVar85;
  auVar34 = vshufps_avx(auVar35,auVar35,0x55);
  aVar2 = (pre->ray_space).vx.field_0;
  auVar35 = vshufps_avx(auVar35,auVar35,0xaa);
  aVar3 = (pre->ray_space).vy.field_0;
  fVar208 = (pre->ray_space).vz.field_0.m128[0];
  fVar189 = (pre->ray_space).vz.field_0.m128[1];
  fVar201 = (pre->ray_space).vz.field_0.m128[2];
  fVar203 = (pre->ray_space).vz.field_0.m128[3];
  auVar90._0_4_ = fVar208 * auVar35._0_4_;
  auVar90._4_4_ = fVar189 * auVar35._4_4_;
  auVar90._8_4_ = fVar201 * auVar35._8_4_;
  auVar90._12_4_ = fVar203 * auVar35._12_4_;
  auVar34 = vfmadd231ps_fma(auVar90,(undefined1  [16])aVar3,auVar34);
  auVar44 = vfmadd231ps_fma(auVar34,(undefined1  [16])aVar2,auVar96);
  auVar35 = vsubps_avx512vl(local_1e8,(undefined1  [16])aVar1);
  uVar85 = auVar35._0_4_;
  auVar105._4_4_ = uVar85;
  auVar105._0_4_ = uVar85;
  auVar105._8_4_ = uVar85;
  auVar105._12_4_ = uVar85;
  auVar34 = vshufps_avx(auVar35,auVar35,0x55);
  auVar35 = vshufps_avx(auVar35,auVar35,0xaa);
  auVar97._0_4_ = fVar208 * auVar35._0_4_;
  auVar97._4_4_ = fVar189 * auVar35._4_4_;
  auVar97._8_4_ = fVar201 * auVar35._8_4_;
  auVar97._12_4_ = fVar203 * auVar35._12_4_;
  auVar34 = vfmadd231ps_fma(auVar97,(undefined1  [16])aVar3,auVar34);
  auVar45 = vfmadd231ps_fma(auVar34,(undefined1  [16])aVar2,auVar105);
  auVar35 = vsubps_avx512vl(local_1f8,(undefined1  [16])aVar1);
  uVar85 = auVar35._0_4_;
  auVar156._4_4_ = uVar85;
  auVar156._0_4_ = uVar85;
  auVar156._8_4_ = uVar85;
  auVar156._12_4_ = uVar85;
  auVar34 = vshufps_avx(auVar35,auVar35,0x55);
  auVar35 = vshufps_avx(auVar35,auVar35,0xaa);
  auVar106._0_4_ = fVar208 * auVar35._0_4_;
  auVar106._4_4_ = fVar189 * auVar35._4_4_;
  auVar106._8_4_ = fVar201 * auVar35._8_4_;
  auVar106._12_4_ = fVar203 * auVar35._12_4_;
  auVar34 = vfmadd231ps_fma(auVar106,(undefined1  [16])aVar3,auVar34);
  auVar43 = vfmadd231ps_fma(auVar34,(undefined1  [16])aVar2,auVar156);
  auVar35 = vsubps_avx(local_1c8,(undefined1  [16])aVar1);
  uVar85 = auVar35._0_4_;
  auVar166._4_4_ = uVar85;
  auVar166._0_4_ = uVar85;
  auVar166._8_4_ = uVar85;
  auVar166._12_4_ = uVar85;
  auVar34 = vshufps_avx(auVar35,auVar35,0x55);
  auVar35 = vshufps_avx(auVar35,auVar35,0xaa);
  auVar157._0_4_ = fVar208 * auVar35._0_4_;
  auVar157._4_4_ = fVar189 * auVar35._4_4_;
  auVar157._8_4_ = fVar201 * auVar35._8_4_;
  auVar157._12_4_ = fVar203 * auVar35._12_4_;
  auVar34 = vfmadd231ps_fma(auVar157,(undefined1  [16])aVar3,auVar34);
  auVar49 = vfmadd231ps_fma(auVar34,(undefined1  [16])aVar2,auVar166);
  auVar35 = vsubps_avx(_local_1b8,(undefined1  [16])aVar1);
  uVar85 = auVar35._0_4_;
  auVar173._4_4_ = uVar85;
  auVar173._0_4_ = uVar85;
  auVar173._8_4_ = uVar85;
  auVar173._12_4_ = uVar85;
  auVar34 = vshufps_avx(auVar35,auVar35,0x55);
  auVar35 = vshufps_avx(auVar35,auVar35,0xaa);
  auVar167._0_4_ = auVar35._0_4_ * fVar208;
  auVar167._4_4_ = auVar35._4_4_ * fVar189;
  auVar167._8_4_ = auVar35._8_4_ * fVar201;
  auVar167._12_4_ = auVar35._12_4_ * fVar203;
  auVar34 = vfmadd231ps_fma(auVar167,(undefined1  [16])aVar3,auVar34);
  auVar40 = vfmadd231ps_fma(auVar34,(undefined1  [16])aVar2,auVar173);
  auVar35 = vsubps_avx512vl(_local_208,(undefined1  [16])aVar1);
  uVar85 = auVar35._0_4_;
  auVar183._4_4_ = uVar85;
  auVar183._0_4_ = uVar85;
  auVar183._8_4_ = uVar85;
  auVar183._12_4_ = uVar85;
  auVar34 = vshufps_avx(auVar35,auVar35,0x55);
  auVar35 = vshufps_avx(auVar35,auVar35,0xaa);
  auVar174._0_4_ = auVar35._0_4_ * fVar208;
  auVar174._4_4_ = auVar35._4_4_ * fVar189;
  auVar174._8_4_ = auVar35._8_4_ * fVar201;
  auVar174._12_4_ = auVar35._12_4_ * fVar203;
  auVar34 = vfmadd231ps_fma(auVar174,(undefined1  [16])aVar3,auVar34);
  auVar48 = vfmadd231ps_fma(auVar34,(undefined1  [16])aVar2,auVar183);
  auVar35 = vsubps_avx512vl(_local_218,(undefined1  [16])aVar1);
  uVar85 = auVar35._0_4_;
  auVar190._4_4_ = uVar85;
  auVar190._0_4_ = uVar85;
  auVar190._8_4_ = uVar85;
  auVar190._12_4_ = uVar85;
  auVar34 = vshufps_avx(auVar35,auVar35,0x55);
  auVar35 = vshufps_avx(auVar35,auVar35,0xaa);
  auVar184._0_4_ = auVar35._0_4_ * fVar208;
  auVar184._4_4_ = auVar35._4_4_ * fVar189;
  auVar184._8_4_ = auVar35._8_4_ * fVar201;
  auVar184._12_4_ = auVar35._12_4_ * fVar203;
  auVar34 = vfmadd231ps_fma(auVar184,(undefined1  [16])aVar3,auVar34);
  auVar38 = vfmadd231ps_fma(auVar34,(undefined1  [16])aVar2,auVar190);
  auVar35 = vsubps_avx512vl(_local_1d8,(undefined1  [16])aVar1);
  uVar85 = auVar35._0_4_;
  auVar191._4_4_ = uVar85;
  auVar191._0_4_ = uVar85;
  auVar191._8_4_ = uVar85;
  auVar191._12_4_ = uVar85;
  auVar34 = vshufps_avx(auVar35,auVar35,0x55);
  auVar35 = vshufps_avx(auVar35,auVar35,0xaa);
  auVar127._0_4_ = fVar208 * auVar35._0_4_;
  auVar127._4_4_ = fVar189 * auVar35._4_4_;
  auVar127._8_4_ = fVar201 * auVar35._8_4_;
  auVar127._12_4_ = fVar203 * auVar35._12_4_;
  auVar34 = vfmadd231ps_fma(auVar127,(undefined1  [16])aVar3,auVar34);
  auVar39 = vfmadd231ps_fma(auVar34,(undefined1  [16])aVar2,auVar191);
  local_2f8 = vmovlhps_avx512f(auVar44,auVar40);
  auVar242 = ZEXT1664(local_2f8);
  local_258 = vmovlhps_avx(auVar45,auVar48);
  local_268 = vmovlhps_avx512f(auVar43,auVar38);
  _local_f8 = vmovlhps_avx512f(auVar49,auVar39);
  auVar34 = vminps_avx512vl(local_2f8,local_258);
  auVar36 = vmaxps_avx512vl(local_2f8,local_258);
  auVar35 = vminps_avx512vl(local_268,_local_f8);
  auVar35 = vminps_avx(auVar34,auVar35);
  auVar34 = vmaxps_avx512vl(local_268,_local_f8);
  auVar34 = vmaxps_avx(auVar36,auVar34);
  auVar36 = vshufpd_avx(auVar35,auVar35,3);
  auVar37 = vshufpd_avx(auVar34,auVar34,3);
  auVar35 = vminps_avx(auVar35,auVar36);
  auVar34 = vmaxps_avx(auVar34,auVar37);
  auVar35 = vandps_avx512vl(auVar35,auVar238._0_16_);
  auVar34 = vandps_avx512vl(auVar34,auVar238._0_16_);
  auVar34 = vmaxps_avx(auVar35,auVar34);
  auVar35 = vmovshdup_avx(auVar34);
  auVar34 = vmaxss_avx(auVar35,auVar34);
  local_278._8_8_ = auVar44._0_8_;
  local_278._0_8_ = auVar44._0_8_;
  local_288 = vmovddup_avx512vl(auVar45);
  local_298 = vmovddup_avx512vl(auVar43);
  local_2a8._0_8_ = auVar49._0_8_;
  local_2a8._8_8_ = local_2a8._0_8_;
  register0x00001348 = auVar40._0_8_;
  local_2b8 = auVar40._0_8_;
  register0x00001388 = auVar48._0_8_;
  local_2c8 = auVar48._0_8_;
  register0x00001408 = auVar38._0_8_;
  local_2d8 = auVar38._0_8_;
  register0x00001448 = auVar39._0_8_;
  local_2e8 = auVar39._0_8_;
  local_108 = ZEXT416((uint)(auVar34._0_4_ * 9.536743e-07));
  local_b8 = vbroadcastss_avx512vl(local_108);
  auVar34 = vxorps_avx512vl(local_b8._0_16_,auVar86);
  local_78 = auVar34._0_4_;
  uStack_74 = local_78;
  uStack_70 = local_78;
  uStack_6c = local_78;
  uStack_68 = local_78;
  uStack_64 = local_78;
  uStack_60 = local_78;
  uStack_5c = local_78;
  local_c8 = vsubps_avx512vl(local_258,local_2f8);
  local_d8 = vsubps_avx512vl(local_268,local_258);
  local_e8 = vsubps_avx512vl(_local_f8,local_268);
  local_118 = vsubps_avx(_local_1b8,local_1a8);
  local_128 = vsubps_avx512vl(_local_208,local_1e8);
  local_138 = vsubps_avx512vl(_local_218,local_1f8);
  _local_148 = vsubps_avx512vl(_local_1d8,local_1c8);
  uVar22 = 0;
  auVar34 = ZEXT816(0x3f80000000000000);
  auVar98 = auVar34;
LAB_0180dbbb:
  auVar240 = ZEXT3264(local_b8);
  auVar35 = vshufps_avx(auVar98,auVar98,0x50);
  auVar226._8_4_ = 0x3f800000;
  auVar226._0_8_ = 0x3f8000003f800000;
  auVar226._12_4_ = 0x3f800000;
  auVar229._16_4_ = 0x3f800000;
  auVar229._0_16_ = auVar226;
  auVar229._20_4_ = 0x3f800000;
  auVar229._24_4_ = 0x3f800000;
  auVar229._28_4_ = 0x3f800000;
  auVar36 = vsubps_avx(auVar226,auVar35);
  fVar208 = auVar35._0_4_;
  auVar128._0_4_ = local_2b8._0_4_ * fVar208;
  fVar189 = auVar35._4_4_;
  auVar128._4_4_ = local_2b8._4_4_ * fVar189;
  fVar201 = auVar35._8_4_;
  auVar128._8_4_ = local_2b8._8_4_ * fVar201;
  fVar203 = auVar35._12_4_;
  auVar128._12_4_ = local_2b8._12_4_ * fVar203;
  auVar139._0_4_ = local_2c8._0_4_ * fVar208;
  auVar139._4_4_ = local_2c8._4_4_ * fVar189;
  auVar139._8_4_ = local_2c8._8_4_ * fVar201;
  auVar139._12_4_ = local_2c8._12_4_ * fVar203;
  auVar148._0_4_ = local_2d8._0_4_ * fVar208;
  auVar148._4_4_ = local_2d8._4_4_ * fVar189;
  auVar148._8_4_ = local_2d8._8_4_ * fVar201;
  auVar148._12_4_ = local_2d8._12_4_ * fVar203;
  auVar107._0_4_ = local_2e8._0_4_ * fVar208;
  auVar107._4_4_ = local_2e8._4_4_ * fVar189;
  auVar107._8_4_ = local_2e8._8_4_ * fVar201;
  auVar107._12_4_ = local_2e8._12_4_ * fVar203;
  auVar37 = vfmadd231ps_fma(auVar128,auVar36,local_278);
  auVar44 = vfmadd231ps_avx512vl(auVar139,auVar36,local_288);
  auVar45 = vfmadd231ps_avx512vl(auVar148,auVar36,local_298);
  auVar36 = vfmadd231ps_fma(auVar107,local_2a8,auVar36);
  auVar35 = vmovshdup_avx(auVar34);
  fVar189 = auVar34._0_4_;
  fVar208 = (auVar35._0_4_ - fVar189) * 0.04761905;
  auVar66._4_4_ = fVar189;
  auVar66._0_4_ = fVar189;
  auVar66._8_4_ = fVar189;
  auVar66._12_4_ = fVar189;
  auVar66._16_4_ = fVar189;
  auVar66._20_4_ = fVar189;
  auVar66._24_4_ = fVar189;
  auVar66._28_4_ = fVar189;
  auVar61._0_8_ = auVar35._0_8_;
  auVar61._8_8_ = auVar61._0_8_;
  auVar61._16_8_ = auVar61._0_8_;
  auVar61._24_8_ = auVar61._0_8_;
  auVar69 = vsubps_avx(auVar61,auVar66);
  uVar85 = auVar37._0_4_;
  auVar71._4_4_ = uVar85;
  auVar71._0_4_ = uVar85;
  auVar71._8_4_ = uVar85;
  auVar71._12_4_ = uVar85;
  auVar71._16_4_ = uVar85;
  auVar71._20_4_ = uVar85;
  auVar71._24_4_ = uVar85;
  auVar71._28_4_ = uVar85;
  auVar131._8_4_ = 1;
  auVar131._0_8_ = 0x100000001;
  auVar131._12_4_ = 1;
  auVar131._16_4_ = 1;
  auVar131._20_4_ = 1;
  auVar131._24_4_ = 1;
  auVar131._28_4_ = 1;
  auVar68 = ZEXT1632(auVar37);
  auVar67 = vpermps_avx2(auVar131,auVar68);
  auVar52 = vbroadcastss_avx512vl(auVar44);
  auVar62 = ZEXT1632(auVar44);
  auVar53 = vpermps_avx512vl(auVar131,auVar62);
  auVar54 = vbroadcastss_avx512vl(auVar45);
  auVar63 = ZEXT1632(auVar45);
  auVar55 = vpermps_avx512vl(auVar131,auVar63);
  auVar56 = vbroadcastss_avx512vl(auVar36);
  auVar65 = ZEXT1632(auVar36);
  auVar57 = vpermps_avx512vl(auVar131,auVar65);
  auVar145._4_4_ = fVar208;
  auVar145._0_4_ = fVar208;
  auVar145._8_4_ = fVar208;
  auVar145._12_4_ = fVar208;
  auVar145._16_4_ = fVar208;
  auVar145._20_4_ = fVar208;
  auVar145._24_4_ = fVar208;
  auVar145._28_4_ = fVar208;
  auVar64._8_4_ = 2;
  auVar64._0_8_ = 0x200000002;
  auVar64._12_4_ = 2;
  auVar64._16_4_ = 2;
  auVar64._20_4_ = 2;
  auVar64._24_4_ = 2;
  auVar64._28_4_ = 2;
  auVar58 = vpermps_avx512vl(auVar64,auVar68);
  auVar59 = vbroadcastss_avx512vl(ZEXT416(3));
  auVar60 = vpermps_avx512vl(auVar59,auVar68);
  auVar61 = vpermps_avx512vl(auVar64,auVar62);
  auVar62 = vpermps_avx512vl(auVar59,auVar62);
  auVar68 = vpermps_avx2(auVar64,auVar63);
  auVar63 = vpermps_avx512vl(auVar59,auVar63);
  auVar64 = vpermps_avx512vl(auVar64,auVar65);
  auVar65 = vpermps_avx512vl(auVar59,auVar65);
  auVar35 = vfmadd132ps_fma(auVar69,auVar66,_DAT_01f7b040);
  auVar69 = vsubps_avx(auVar229,ZEXT1632(auVar35));
  auVar59 = vmulps_avx512vl(auVar52,ZEXT1632(auVar35));
  auVar70 = ZEXT1632(auVar35);
  auVar66 = vmulps_avx512vl(auVar53,auVar70);
  auVar36 = vfmadd231ps_fma(auVar59,auVar69,auVar71);
  auVar37 = vfmadd231ps_fma(auVar66,auVar69,auVar67);
  auVar59 = vmulps_avx512vl(auVar54,auVar70);
  auVar66 = vmulps_avx512vl(auVar55,auVar70);
  auVar52 = vfmadd231ps_avx512vl(auVar59,auVar69,auVar52);
  auVar53 = vfmadd231ps_avx512vl(auVar66,auVar69,auVar53);
  auVar59 = vmulps_avx512vl(auVar56,auVar70);
  auVar71 = ZEXT1632(auVar35);
  auVar57 = vmulps_avx512vl(auVar57,auVar71);
  auVar59 = vfmadd231ps_avx512vl(auVar59,auVar69,auVar54);
  auVar66 = vfmadd231ps_avx512vl(auVar57,auVar69,auVar55);
  fVar201 = auVar35._0_4_;
  fVar203 = auVar35._4_4_;
  auVar54._4_4_ = fVar203 * auVar52._4_4_;
  auVar54._0_4_ = fVar201 * auVar52._0_4_;
  fVar205 = auVar35._8_4_;
  auVar54._8_4_ = fVar205 * auVar52._8_4_;
  fVar206 = auVar35._12_4_;
  auVar54._12_4_ = fVar206 * auVar52._12_4_;
  auVar54._16_4_ = auVar52._16_4_ * 0.0;
  auVar54._20_4_ = auVar52._20_4_ * 0.0;
  auVar54._24_4_ = auVar52._24_4_ * 0.0;
  auVar54._28_4_ = fVar189;
  auVar55._4_4_ = fVar203 * auVar53._4_4_;
  auVar55._0_4_ = fVar201 * auVar53._0_4_;
  auVar55._8_4_ = fVar205 * auVar53._8_4_;
  auVar55._12_4_ = fVar206 * auVar53._12_4_;
  auVar55._16_4_ = auVar53._16_4_ * 0.0;
  auVar55._20_4_ = auVar53._20_4_ * 0.0;
  auVar55._24_4_ = auVar53._24_4_ * 0.0;
  auVar55._28_4_ = auVar67._28_4_;
  auVar36 = vfmadd231ps_fma(auVar54,auVar69,ZEXT1632(auVar36));
  auVar37 = vfmadd231ps_fma(auVar55,auVar69,ZEXT1632(auVar37));
  auVar70._0_4_ = fVar201 * auVar59._0_4_;
  auVar70._4_4_ = fVar203 * auVar59._4_4_;
  auVar70._8_4_ = fVar205 * auVar59._8_4_;
  auVar70._12_4_ = fVar206 * auVar59._12_4_;
  auVar70._16_4_ = auVar59._16_4_ * 0.0;
  auVar70._20_4_ = auVar59._20_4_ * 0.0;
  auVar70._24_4_ = auVar59._24_4_ * 0.0;
  auVar70._28_4_ = 0;
  auVar57._4_4_ = fVar203 * auVar66._4_4_;
  auVar57._0_4_ = fVar201 * auVar66._0_4_;
  auVar57._8_4_ = fVar205 * auVar66._8_4_;
  auVar57._12_4_ = fVar206 * auVar66._12_4_;
  auVar57._16_4_ = auVar66._16_4_ * 0.0;
  auVar57._20_4_ = auVar66._20_4_ * 0.0;
  auVar57._24_4_ = auVar66._24_4_ * 0.0;
  auVar57._28_4_ = auVar59._28_4_;
  auVar44 = vfmadd231ps_fma(auVar70,auVar69,auVar52);
  auVar45 = vfmadd231ps_fma(auVar57,auVar69,auVar53);
  auVar59._28_4_ = auVar53._28_4_;
  auVar59._0_28_ =
       ZEXT1628(CONCAT412(fVar206 * auVar45._12_4_,
                          CONCAT48(fVar205 * auVar45._8_4_,
                                   CONCAT44(fVar203 * auVar45._4_4_,fVar201 * auVar45._0_4_))));
  auVar43 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar206 * auVar44._12_4_,
                                               CONCAT48(fVar205 * auVar44._8_4_,
                                                        CONCAT44(fVar203 * auVar44._4_4_,
                                                                 fVar201 * auVar44._0_4_)))),auVar69
                            ,ZEXT1632(auVar36));
  auVar49 = vfmadd231ps_fma(auVar59,auVar69,ZEXT1632(auVar37));
  auVar67 = vsubps_avx(ZEXT1632(auVar44),ZEXT1632(auVar36));
  auVar52 = vsubps_avx(ZEXT1632(auVar45),ZEXT1632(auVar37));
  auVar53 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
  auVar67 = vmulps_avx512vl(auVar67,auVar53);
  auVar52 = vmulps_avx512vl(auVar52,auVar53);
  auVar72._0_4_ = fVar208 * auVar67._0_4_;
  auVar72._4_4_ = fVar208 * auVar67._4_4_;
  auVar72._8_4_ = fVar208 * auVar67._8_4_;
  auVar72._12_4_ = fVar208 * auVar67._12_4_;
  auVar72._16_4_ = fVar208 * auVar67._16_4_;
  auVar72._20_4_ = fVar208 * auVar67._20_4_;
  auVar72._24_4_ = fVar208 * auVar67._24_4_;
  auVar72._28_4_ = 0;
  auVar67 = vmulps_avx512vl(auVar145,auVar52);
  auVar37 = vxorps_avx512vl(auVar56._0_16_,auVar56._0_16_);
  auVar54 = vpermt2ps_avx512vl(ZEXT1632(auVar43),_DAT_01fb9fc0,ZEXT1632(auVar37));
  auVar55 = vpermt2ps_avx512vl(ZEXT1632(auVar49),_DAT_01fb9fc0,ZEXT1632(auVar37));
  auVar111._0_4_ = auVar72._0_4_ + auVar43._0_4_;
  auVar111._4_4_ = auVar72._4_4_ + auVar43._4_4_;
  auVar111._8_4_ = auVar72._8_4_ + auVar43._8_4_;
  auVar111._12_4_ = auVar72._12_4_ + auVar43._12_4_;
  auVar111._16_4_ = auVar72._16_4_ + 0.0;
  auVar111._20_4_ = auVar72._20_4_ + 0.0;
  auVar111._24_4_ = auVar72._24_4_ + 0.0;
  auVar111._28_4_ = 0;
  auVar66 = ZEXT1632(auVar37);
  auVar52 = vpermt2ps_avx512vl(auVar72,_DAT_01fb9fc0,auVar66);
  auVar57 = vaddps_avx512vl(ZEXT1632(auVar49),auVar67);
  auVar59 = vpermt2ps_avx512vl(auVar67,_DAT_01fb9fc0,auVar66);
  auVar67 = vsubps_avx(auVar54,auVar52);
  auVar59 = vsubps_avx512vl(auVar55,auVar59);
  auVar52 = vmulps_avx512vl(auVar61,auVar71);
  auVar56 = vmulps_avx512vl(auVar62,auVar71);
  auVar52 = vfmadd231ps_avx512vl(auVar52,auVar69,auVar58);
  auVar56 = vfmadd231ps_avx512vl(auVar56,auVar69,auVar60);
  auVar58 = vmulps_avx512vl(auVar68,auVar71);
  auVar60 = vmulps_avx512vl(auVar63,auVar71);
  auVar58 = vfmadd231ps_avx512vl(auVar58,auVar69,auVar61);
  auVar60 = vfmadd231ps_avx512vl(auVar60,auVar69,auVar62);
  auVar61 = vmulps_avx512vl(auVar64,auVar71);
  auVar62 = vmulps_avx512vl(auVar65,auVar71);
  auVar36 = vfmadd231ps_fma(auVar61,auVar69,auVar68);
  auVar68 = vfmadd231ps_avx512vl(auVar62,auVar69,auVar63);
  auVar61 = vmulps_avx512vl(auVar71,auVar58);
  auVar64 = ZEXT1632(auVar35);
  auVar62 = vmulps_avx512vl(auVar64,auVar60);
  auVar52 = vfmadd231ps_avx512vl(auVar61,auVar69,auVar52);
  auVar61 = vfmadd231ps_avx512vl(auVar62,auVar69,auVar56);
  auVar68 = vmulps_avx512vl(auVar64,auVar68);
  auVar58 = vfmadd231ps_avx512vl
                      (ZEXT1632(CONCAT412(fVar206 * auVar36._12_4_,
                                          CONCAT48(fVar205 * auVar36._8_4_,
                                                   CONCAT44(fVar203 * auVar36._4_4_,
                                                            fVar201 * auVar36._0_4_)))),auVar69,
                       auVar58);
  auVar68 = vfmadd231ps_avx512vl(auVar68,auVar69,auVar60);
  auVar56._4_4_ = fVar203 * auVar58._4_4_;
  auVar56._0_4_ = fVar201 * auVar58._0_4_;
  auVar56._8_4_ = fVar205 * auVar58._8_4_;
  auVar56._12_4_ = fVar206 * auVar58._12_4_;
  auVar56._16_4_ = auVar58._16_4_ * 0.0;
  auVar56._20_4_ = auVar58._20_4_ * 0.0;
  auVar56._24_4_ = auVar58._24_4_ * 0.0;
  auVar56._28_4_ = auVar63._28_4_;
  auVar60 = vmulps_avx512vl(auVar64,auVar68);
  auVar56 = vfmadd231ps_avx512vl(auVar56,auVar69,auVar52);
  auVar62 = vfmadd231ps_avx512vl(auVar60,auVar61,auVar69);
  auVar69 = vsubps_avx512vl(auVar58,auVar52);
  auVar52 = vsubps_avx512vl(auVar68,auVar61);
  auVar69 = vmulps_avx512vl(auVar69,auVar53);
  auVar52 = vmulps_avx512vl(auVar52,auVar53);
  fVar189 = fVar208 * auVar69._0_4_;
  fVar201 = fVar208 * auVar69._4_4_;
  auVar58._4_4_ = fVar201;
  auVar58._0_4_ = fVar189;
  fVar203 = fVar208 * auVar69._8_4_;
  auVar58._8_4_ = fVar203;
  fVar205 = fVar208 * auVar69._12_4_;
  auVar58._12_4_ = fVar205;
  fVar206 = fVar208 * auVar69._16_4_;
  auVar58._16_4_ = fVar206;
  fVar207 = fVar208 * auVar69._20_4_;
  auVar58._20_4_ = fVar207;
  fVar208 = fVar208 * auVar69._24_4_;
  auVar58._24_4_ = fVar208;
  auVar58._28_4_ = auVar69._28_4_;
  auVar52 = vmulps_avx512vl(auVar145,auVar52);
  auVar68 = vpermt2ps_avx512vl(auVar56,_DAT_01fb9fc0,auVar66);
  auVar53 = vpermt2ps_avx512vl(auVar62,_DAT_01fb9fc0,auVar66);
  auVar187._0_4_ = auVar56._0_4_ + fVar189;
  auVar187._4_4_ = auVar56._4_4_ + fVar201;
  auVar187._8_4_ = auVar56._8_4_ + fVar203;
  auVar187._12_4_ = auVar56._12_4_ + fVar205;
  auVar187._16_4_ = auVar56._16_4_ + fVar206;
  auVar187._20_4_ = auVar56._20_4_ + fVar207;
  auVar187._24_4_ = auVar56._24_4_ + fVar208;
  auVar187._28_4_ = auVar56._28_4_ + auVar69._28_4_;
  auVar69 = vpermt2ps_avx512vl(auVar58,_DAT_01fb9fc0,ZEXT1632(auVar37));
  auVar58 = vaddps_avx512vl(auVar62,auVar52);
  auVar60 = vpermt2ps_avx512vl(auVar52,_DAT_01fb9fc0,ZEXT1632(auVar37));
  auVar52 = vsubps_avx(auVar68,auVar69);
  auVar61 = vsubps_avx512vl(auVar53,auVar60);
  in_ZMM17 = ZEXT3264(auVar61);
  auVar131 = ZEXT1632(auVar43);
  auVar69 = vsubps_avx512vl(auVar56,auVar131);
  auVar145 = ZEXT1632(auVar49);
  auVar60 = vsubps_avx512vl(auVar62,auVar145);
  auVar63 = vsubps_avx512vl(auVar68,auVar54);
  auVar69 = vaddps_avx512vl(auVar69,auVar63);
  auVar63 = vsubps_avx512vl(auVar53,auVar55);
  auVar60 = vaddps_avx512vl(auVar60,auVar63);
  auVar63 = vmulps_avx512vl(auVar145,auVar69);
  auVar63 = vfnmadd231ps_avx512vl(auVar63,auVar131,auVar60);
  auVar64 = vmulps_avx512vl(auVar57,auVar69);
  auVar64 = vfnmadd231ps_avx512vl(auVar64,auVar111,auVar60);
  auVar65 = vmulps_avx512vl(auVar59,auVar69);
  auVar65 = vfnmadd231ps_avx512vl(auVar65,auVar67,auVar60);
  auVar66 = vmulps_avx512vl(auVar55,auVar69);
  auVar66 = vfnmadd231ps_avx512vl(auVar66,auVar54,auVar60);
  auVar70 = vmulps_avx512vl(auVar62,auVar69);
  auVar70 = vfnmadd231ps_avx512vl(auVar70,auVar56,auVar60);
  auVar71 = vmulps_avx512vl(auVar58,auVar69);
  auVar71 = vfnmadd231ps_avx512vl(auVar71,auVar187,auVar60);
  auVar72 = vmulps_avx512vl(auVar61,auVar69);
  auVar72 = vfnmadd231ps_avx512vl(auVar72,auVar52,auVar60);
  auVar69 = vmulps_avx512vl(auVar53,auVar69);
  auVar69 = vfnmadd231ps_avx512vl(auVar69,auVar68,auVar60);
  auVar60 = vminps_avx512vl(auVar63,auVar64);
  auVar63 = vmaxps_avx512vl(auVar63,auVar64);
  auVar64 = vminps_avx512vl(auVar65,auVar66);
  auVar60 = vminps_avx512vl(auVar60,auVar64);
  auVar64 = vmaxps_avx512vl(auVar65,auVar66);
  auVar63 = vmaxps_avx512vl(auVar63,auVar64);
  auVar64 = vminps_avx512vl(auVar70,auVar71);
  auVar65 = vmaxps_avx512vl(auVar70,auVar71);
  auVar66 = vminps_avx512vl(auVar72,auVar69);
  auVar64 = vminps_avx512vl(auVar64,auVar66);
  auVar60 = vminps_avx512vl(auVar60,auVar64);
  auVar69 = vmaxps_avx512vl(auVar72,auVar69);
  auVar69 = vmaxps_avx512vl(auVar65,auVar69);
  auVar69 = vmaxps_avx512vl(auVar63,auVar69);
  uVar10 = vcmpps_avx512vl(auVar60,local_b8,2);
  auVar60._4_4_ = uStack_74;
  auVar60._0_4_ = local_78;
  auVar60._8_4_ = uStack_70;
  auVar60._12_4_ = uStack_6c;
  auVar60._16_4_ = uStack_68;
  auVar60._20_4_ = uStack_64;
  auVar60._24_4_ = uStack_60;
  auVar60._28_4_ = uStack_5c;
  uVar11 = vcmpps_avx512vl(auVar69,auVar60,5);
  bVar20 = (byte)uVar10 & (byte)uVar11 & 0x7f;
  auVar69 = _DAT_01fb9fe0;
  if (bVar20 == 0) {
    auVar67 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
    auVar235 = ZEXT3264(auVar67);
    auVar34 = vbroadcastss_avx512vl(ZEXT416(0x3e124925));
    auVar236 = ZEXT1664(auVar34);
    auVar237 = ZEXT3264(_DAT_01fb9fe0);
  }
  else {
    auVar63 = vsubps_avx512vl(auVar54,auVar131);
    auVar64 = vsubps_avx512vl(auVar55,auVar145);
    auVar65 = vsubps_avx512vl(auVar68,auVar56);
    auVar63 = vaddps_avx512vl(auVar63,auVar65);
    auVar65 = vsubps_avx512vl(auVar53,auVar62);
    auVar64 = vaddps_avx512vl(auVar64,auVar65);
    auVar65 = vmulps_avx512vl(auVar145,auVar63);
    auVar65 = vfnmadd231ps_avx512vl(auVar65,auVar64,auVar131);
    auVar57 = vmulps_avx512vl(auVar57,auVar63);
    auVar57 = vfnmadd213ps_avx512vl(auVar111,auVar64,auVar57);
    auVar59 = vmulps_avx512vl(auVar59,auVar63);
    auVar59 = vfnmadd213ps_avx512vl(auVar67,auVar64,auVar59);
    auVar67 = vmulps_avx512vl(auVar55,auVar63);
    auVar54 = vfnmadd231ps_avx512vl(auVar67,auVar64,auVar54);
    auVar67 = vmulps_avx512vl(auVar62,auVar63);
    auVar55 = vfnmadd231ps_avx512vl(auVar67,auVar64,auVar56);
    auVar67 = vmulps_avx512vl(auVar58,auVar63);
    auVar56 = vfnmadd213ps_avx512vl(auVar187,auVar64,auVar67);
    auVar67 = vmulps_avx512vl(auVar61,auVar63);
    auVar58 = vfnmadd213ps_avx512vl(auVar52,auVar64,auVar67);
    auVar67 = vmulps_avx512vl(auVar53,auVar63);
    auVar61 = vfnmadd231ps_avx512vl(auVar67,auVar68,auVar64);
    auVar52 = vminps_avx(auVar65,auVar57);
    auVar67 = vmaxps_avx(auVar65,auVar57);
    auVar68 = vminps_avx(auVar59,auVar54);
    auVar68 = vminps_avx(auVar52,auVar68);
    auVar52 = vmaxps_avx(auVar59,auVar54);
    auVar67 = vmaxps_avx(auVar67,auVar52);
    auVar53 = vminps_avx(auVar55,auVar56);
    auVar52 = vmaxps_avx(auVar55,auVar56);
    auVar54 = vminps_avx(auVar58,auVar61);
    auVar53 = vminps_avx(auVar53,auVar54);
    auVar53 = vminps_avx(auVar68,auVar53);
    auVar68 = vmaxps_avx(auVar58,auVar61);
    auVar52 = vmaxps_avx(auVar52,auVar68);
    auVar67 = vmaxps_avx(auVar67,auVar52);
    uVar10 = vcmpps_avx512vl(auVar67,auVar60,5);
    uVar11 = vcmpps_avx512vl(auVar53,local_b8,2);
    bVar20 = bVar20 & (byte)uVar10 & (byte)uVar11;
    if (bVar20 != 0) {
      auStack_198[uVar22] = (uint)bVar20;
      uVar10 = vmovlps_avx(auVar34);
      (&uStack_98)[uVar22] = uVar10;
      uVar28 = vmovlps_avx(auVar98);
      auStack_58[uVar22] = uVar28;
      uVar22 = (ulong)((int)uVar22 + 1);
    }
    auVar67 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
    auVar235 = ZEXT3264(auVar67);
    auVar34 = vbroadcastss_avx512vl(ZEXT416(0x3e124925));
    auVar236 = ZEXT1664(auVar34);
    auVar237 = ZEXT3264(_DAT_01fb9fe0);
  }
LAB_0180e115:
  do {
    do {
      do {
        auVar36 = auVar239._0_16_;
        auVar35 = SUB6416(ZEXT464(0xb8d1b717),0);
        if ((int)uVar22 == 0) {
          fVar208 = (ray->super_RayK<1>).tfar;
          auVar18._4_4_ = fVar208;
          auVar18._0_4_ = fVar208;
          auVar18._8_4_ = fVar208;
          auVar18._12_4_ = fVar208;
          uVar10 = vcmpps_avx512vl(local_158,auVar18,2);
          uVar27 = (ulong)((uint)uVar27 & (uint)uVar10);
          goto LAB_0180d4fe;
        }
        uVar21 = (int)uVar22 - 1;
        uVar23 = (ulong)uVar21;
        uVar5 = auStack_198[uVar23];
        auVar98._8_8_ = 0;
        auVar98._0_8_ = auStack_58[uVar23];
        uVar28 = 0;
        for (uVar26 = (ulong)uVar5; (uVar26 & 1) == 0; uVar26 = uVar26 >> 1 | 0x8000000000000000) {
          uVar28 = uVar28 + 1;
        }
        uVar25 = uVar5 - 1 & uVar5;
        bVar31 = uVar25 == 0;
        auStack_198[uVar23] = uVar25;
        if (bVar31) {
          uVar22 = (ulong)uVar21;
        }
        auVar91._8_8_ = 0;
        auVar91._0_8_ = uVar28;
        auVar34 = vpunpcklqdq_avx(auVar91,ZEXT416((int)uVar28 + 1));
        auVar34 = vcvtqq2ps_avx512vl(auVar34);
        auVar34 = vmulps_avx512vl(auVar34,auVar236._0_16_);
        uVar85 = *(undefined4 *)((long)&uStack_98 + uVar23 * 8 + 4);
        auVar12._4_4_ = uVar85;
        auVar12._0_4_ = uVar85;
        auVar12._8_4_ = uVar85;
        auVar12._12_4_ = uVar85;
        auVar37 = vmulps_avx512vl(auVar34,auVar12);
        auVar34 = vsubps_avx512vl(auVar36,auVar34);
        uVar85 = *(undefined4 *)(&uStack_98 + uVar23);
        auVar13._4_4_ = uVar85;
        auVar13._0_4_ = uVar85;
        auVar13._8_4_ = uVar85;
        auVar13._12_4_ = uVar85;
        auVar34 = vfmadd231ps_avx512vl(auVar37,auVar34,auVar13);
        auVar37 = vmovshdup_avx(auVar34);
        fVar208 = auVar37._0_4_ - auVar34._0_4_;
        vucomiss_avx512f(ZEXT416((uint)fVar208));
        if (uVar5 == 0 || bVar31) goto LAB_0180dbbb;
        auVar37 = vshufps_avx(auVar98,auVar98,0x50);
        vucomiss_avx512f(ZEXT416((uint)fVar208));
        bVar29 = (uint)uVar22 < 4;
        uVar21 = (uint)uVar22 - 4;
        bVar32 = uVar21 == 0;
        bVar30 = (POPCOUNT(uVar21 & 0xff) & 1U) == 0;
        auVar43 = vsubps_avx512vl(auVar36,auVar37);
        fVar189 = auVar37._0_4_;
        auVar140._0_4_ = fVar189 * (float)local_2b8._0_4_;
        fVar201 = auVar37._4_4_;
        auVar140._4_4_ = fVar201 * (float)local_2b8._4_4_;
        fVar203 = auVar37._8_4_;
        auVar140._8_4_ = fVar203 * fStack_2b0;
        fVar205 = auVar37._12_4_;
        auVar140._12_4_ = fVar205 * fStack_2ac;
        auVar149._0_4_ = fVar189 * (float)local_2c8._0_4_;
        auVar149._4_4_ = fVar201 * (float)local_2c8._4_4_;
        auVar149._8_4_ = fVar203 * fStack_2c0;
        auVar149._12_4_ = fVar205 * fStack_2bc;
        auVar158._0_4_ = fVar189 * (float)local_2d8._0_4_;
        auVar158._4_4_ = fVar201 * (float)local_2d8._4_4_;
        auVar158._8_4_ = fVar203 * fStack_2d0;
        auVar158._12_4_ = fVar205 * fStack_2cc;
        auVar116._0_4_ = fVar189 * (float)local_2e8._0_4_;
        auVar116._4_4_ = fVar201 * (float)local_2e8._4_4_;
        auVar116._8_4_ = fVar203 * fStack_2e0;
        auVar116._12_4_ = fVar205 * fStack_2dc;
        auVar37 = vfmadd231ps_fma(auVar140,auVar43,local_278);
        auVar44 = vfmadd231ps_fma(auVar149,auVar43,local_288);
        auVar45 = vfmadd231ps_fma(auVar158,auVar43,local_298);
        auVar43 = vfmadd231ps_fma(auVar116,auVar43,local_2a8);
        auVar62._16_16_ = auVar37;
        auVar62._0_16_ = auVar37;
        auVar63._16_16_ = auVar44;
        auVar63._0_16_ = auVar44;
        auVar153._16_16_ = auVar45;
        auVar153._0_16_ = auVar45;
        auVar67 = vpermps_avx512vl(auVar237._0_32_,ZEXT1632(auVar34));
        auVar69 = vsubps_avx(auVar63,auVar62);
        auVar44 = vfmadd213ps_fma(auVar69,auVar67,auVar62);
        auVar69 = vsubps_avx(auVar153,auVar63);
        auVar49 = vfmadd213ps_fma(auVar69,auVar67,auVar63);
        auVar37 = vsubps_avx(auVar43,auVar45);
        auVar65._16_16_ = auVar37;
        auVar65._0_16_ = auVar37;
        auVar37 = vfmadd213ps_fma(auVar65,auVar67,auVar153);
        auVar69 = vsubps_avx(ZEXT1632(auVar49),ZEXT1632(auVar44));
        auVar44 = vfmadd213ps_fma(auVar69,auVar67,ZEXT1632(auVar44));
        auVar69 = vsubps_avx(ZEXT1632(auVar37),ZEXT1632(auVar49));
        auVar37 = vfmadd213ps_fma(auVar69,auVar67,ZEXT1632(auVar49));
        auVar69 = vsubps_avx(ZEXT1632(auVar37),ZEXT1632(auVar44));
        auVar86 = vfmadd231ps_fma(ZEXT1632(auVar44),auVar69,auVar67);
        auVar69 = vmulps_avx512vl(auVar69,auVar235._0_32_);
        auVar37 = vmulss_avx512f(ZEXT416((uint)fVar208),SUB6416(ZEXT464(0x3eaaaaab),0));
        fVar189 = auVar37._0_4_;
        auVar159._0_8_ =
             CONCAT44(auVar86._4_4_ + fVar189 * auVar69._4_4_,
                      auVar86._0_4_ + fVar189 * auVar69._0_4_);
        auVar159._8_4_ = auVar86._8_4_ + fVar189 * auVar69._8_4_;
        auVar159._12_4_ = auVar86._12_4_ + fVar189 * auVar69._12_4_;
        auVar141._0_4_ = fVar189 * auVar69._16_4_;
        auVar141._4_4_ = fVar189 * auVar69._20_4_;
        auVar141._8_4_ = fVar189 * auVar69._24_4_;
        auVar141._12_4_ = fVar189 * auVar69._28_4_;
        auVar39 = vsubps_avx((undefined1  [16])0x0,auVar141);
        auVar49 = vshufpd_avx(auVar86,auVar86,3);
        auVar40 = vshufpd_avx((undefined1  [16])0x0,(undefined1  [16])0x0,3);
        auVar37 = vsubps_avx(auVar49,auVar86);
        auVar44 = vsubps_avx(auVar40,(undefined1  [16])0x0);
        auVar175._0_4_ = auVar37._0_4_ + auVar44._0_4_;
        auVar175._4_4_ = auVar37._4_4_ + auVar44._4_4_;
        auVar175._8_4_ = auVar37._8_4_ + auVar44._8_4_;
        auVar175._12_4_ = auVar37._12_4_ + auVar44._12_4_;
        auVar37 = vshufps_avx(auVar86,auVar86,0xb1);
        auVar44 = vshufps_avx(auVar159,auVar159,0xb1);
        auVar45 = vshufps_avx(auVar39,auVar39,0xb1);
        auVar43 = vshufps_avx((undefined1  [16])0x0,(undefined1  [16])0x0,0xb1);
        auVar227._4_4_ = auVar175._0_4_;
        auVar227._0_4_ = auVar175._0_4_;
        auVar227._8_4_ = auVar175._0_4_;
        auVar227._12_4_ = auVar175._0_4_;
        auVar48 = vshufps_avx(auVar175,auVar175,0x55);
        fVar189 = auVar48._0_4_;
        auVar185._0_4_ = auVar37._0_4_ * fVar189;
        fVar201 = auVar48._4_4_;
        auVar185._4_4_ = auVar37._4_4_ * fVar201;
        fVar203 = auVar48._8_4_;
        auVar185._8_4_ = auVar37._8_4_ * fVar203;
        fVar205 = auVar48._12_4_;
        auVar185._12_4_ = auVar37._12_4_ * fVar205;
        auVar192._0_4_ = auVar44._0_4_ * fVar189;
        auVar192._4_4_ = auVar44._4_4_ * fVar201;
        auVar192._8_4_ = auVar44._8_4_ * fVar203;
        auVar192._12_4_ = auVar44._12_4_ * fVar205;
        auVar211._0_4_ = auVar45._0_4_ * fVar189;
        auVar211._4_4_ = auVar45._4_4_ * fVar201;
        auVar211._8_4_ = auVar45._8_4_ * fVar203;
        auVar211._12_4_ = auVar45._12_4_ * fVar205;
        auVar176._0_4_ = auVar43._0_4_ * fVar189;
        auVar176._4_4_ = auVar43._4_4_ * fVar201;
        auVar176._8_4_ = auVar43._8_4_ * fVar203;
        auVar176._12_4_ = auVar43._12_4_ * fVar205;
        auVar37 = vfmadd231ps_fma(auVar185,auVar227,auVar86);
        auVar44 = vfmadd231ps_fma(auVar192,auVar227,auVar159);
        auVar41 = vfmadd231ps_fma(auVar211,auVar227,auVar39);
        auVar42 = vfmadd231ps_fma(auVar176,(undefined1  [16])0x0,auVar227);
        auVar48 = vshufpd_avx(auVar37,auVar37,1);
        auVar38 = vshufpd_avx(auVar44,auVar44,1);
        auVar46 = vshufpd_avx512vl(auVar41,auVar41,1);
        auVar47 = vshufpd_avx512vl(auVar42,auVar42,1);
        in_ZMM17 = ZEXT1664(auVar47);
        auVar45 = vminss_avx(auVar37,auVar44);
        auVar37 = vmaxss_avx(auVar44,auVar37);
        auVar43 = vminss_avx(auVar41,auVar42);
        auVar44 = vmaxss_avx(auVar42,auVar41);
        auVar45 = vminss_avx(auVar45,auVar43);
        auVar37 = vmaxss_avx(auVar44,auVar37);
        auVar43 = vminss_avx(auVar48,auVar38);
        auVar44 = vmaxss_avx(auVar38,auVar48);
        auVar48 = vminss_avx512f(auVar46,auVar47);
        auVar38 = vmaxss_avx512f(auVar47,auVar46);
        vmaxss_avx(auVar38,auVar44);
        auVar69._0_16_ = vminss_avx512f(auVar43,auVar48);
        vucomiss_avx512f(auVar45);
        if ((!bVar29 && !bVar32) &&
           (auVar44 = vucomiss_avx512f(auVar35), bVar33 = bVar32, !bVar29 && !bVar32)) break;
        auVar44 = vucomiss_avx512f(auVar35);
        auVar43 = vucomiss_avx512f(auVar69._0_16_);
        auVar37 = vucomiss_avx512f(auVar35);
        bVar33 = bVar29 || bVar32;
        bVar30 = bVar29 || bVar32;
        if (!bVar29 && !bVar32) break;
        uVar10 = vcmpps_avx512vl(auVar45,auVar43,5);
        uVar11 = vcmpps_avx512vl(auVar69._0_16_,auVar43,5);
        uVar21 = (uint)uVar10 & (uint)uVar11;
        bVar19 = (uVar21 & 1) == 0;
        bVar33 = (!bVar29 && !bVar32) && bVar19;
        bVar30 = (!bVar29 && !bVar32) && (uVar21 & 1) == 0;
      } while ((bVar29 || bVar32) || !bVar19);
      auVar48 = vxorps_avx512vl(auVar242._0_16_,auVar242._0_16_);
      vcmpss_avx512f(auVar45,auVar48,1);
      uVar10 = vcmpss_avx512f(auVar37,auVar48,1);
      bVar32 = (bool)((byte)uVar10 & 1);
      auVar74._16_16_ = auVar69._16_16_;
      auVar74._0_16_ = SUB6416(ZEXT464(0x3f800000),0);
      auVar73._4_28_ = auVar74._4_28_;
      auVar73._0_4_ = (float)((uint)bVar32 * -0x40800000 + (uint)!bVar32 * 0x3f800000);
      vucomiss_avx512f(auVar73._0_16_);
      bVar30 = (bool)(!bVar33 | bVar30);
      bVar33 = bVar30 == false;
      auVar76._16_16_ = auVar69._16_16_;
      auVar76._0_16_ = SUB6416(ZEXT464(0x7f800000),0);
      auVar75._4_28_ = auVar76._4_28_;
      auVar75._0_4_ = (uint)bVar30 * auVar48._0_4_ + (uint)!bVar30 * 0x7f800000;
      auVar43 = auVar75._0_16_;
      auVar78._16_16_ = auVar69._16_16_;
      auVar78._0_16_ = SUB6416(ZEXT464(0xff800000),0);
      auVar77._4_28_ = auVar78._4_28_;
      auVar77._0_4_ = (uint)bVar30 * auVar48._0_4_ + (uint)!bVar30 * -0x800000;
      auVar35 = auVar77._0_16_;
      auVar38 = vxorps_avx512vl(auVar240._0_16_,auVar240._0_16_);
      auVar240 = ZEXT1664(auVar38);
      uVar10 = vcmpss_avx512f(auVar69._0_16_,auVar48,1);
      bVar32 = (bool)((byte)uVar10 & 1);
      auVar80._16_16_ = auVar69._16_16_;
      auVar80._0_16_ = SUB6416(ZEXT464(0x3f800000),0);
      auVar79._4_28_ = auVar80._4_28_;
      auVar79._0_4_ = (float)((uint)bVar32 * -0x40800000 + (uint)!bVar32 * 0x3f800000);
      vucomiss_avx512f(auVar79._0_16_);
      if ((bVar30) || (bVar33)) {
        auVar48 = vucomiss_avx512f(auVar45);
        if ((bVar30) || (bVar33)) {
          auVar17._8_4_ = 0x80000000;
          auVar17._0_8_ = 0x8000000080000000;
          auVar17._12_4_ = 0x80000000;
          auVar41 = vxorps_avx512vl(auVar45,auVar17);
          auVar45 = vsubss_avx512f(auVar48,auVar45);
          auVar45 = vdivss_avx512f(auVar41,auVar45);
          auVar48 = vsubss_avx512f(ZEXT416(0x3f800000),auVar45);
          auVar48 = vfmadd213ss_avx512f(auVar48,auVar38,auVar45);
          auVar45 = auVar48;
        }
        else {
          auVar45 = vxorps_avx512vl(auVar48,auVar48);
          vucomiss_avx512f(auVar45);
          auVar48 = ZEXT416(0x3f800000);
          if ((bVar30) || (bVar33)) {
            auVar48 = SUB6416(ZEXT464(0xff800000),0);
            auVar45 = SUB6416(ZEXT464(0x7f800000),0);
          }
        }
        auVar43 = vminss_avx512f(auVar43,auVar45);
        auVar35 = vmaxss_avx(auVar48,auVar35);
      }
      in_ZMM17 = ZEXT464(0x3f800000);
      auVar242 = ZEXT1664(local_2f8);
      uVar10 = vcmpss_avx512f(auVar44,auVar38,1);
      bVar30 = (bool)((byte)uVar10 & 1);
      auVar45 = in_ZMM17._0_16_;
      fVar189 = (float)((uint)bVar30 * -0x40800000 + (uint)!bVar30 * 0x3f800000);
      if ((auVar73._0_4_ != fVar189) || (NAN(auVar73._0_4_) || NAN(fVar189))) {
        fVar203 = auVar44._0_4_;
        fVar201 = auVar37._0_4_;
        if ((fVar203 != fVar201) || (NAN(fVar203) || NAN(fVar201))) {
          auVar16._8_4_ = 0x80000000;
          auVar16._0_8_ = 0x8000000080000000;
          auVar16._12_4_ = 0x80000000;
          auVar37 = vxorps_avx512vl(auVar37,auVar16);
          auVar177._0_4_ = auVar37._0_4_ / (fVar203 - fVar201);
          auVar177._4_12_ = auVar37._4_12_;
          auVar37 = vsubss_avx512f(auVar45,auVar177);
          auVar37 = vfmadd213ss_avx512f(auVar37,auVar38,auVar177);
          auVar44 = auVar37;
        }
        else if ((fVar201 != 0.0) || (auVar37 = auVar45, auVar44 = ZEXT816(0) << 0x40, NAN(fVar201))
                ) {
          auVar37 = SUB6416(ZEXT464(0xff800000),0);
          auVar44 = SUB6416(ZEXT464(0x7f800000),0);
        }
        auVar43 = vminss_avx(auVar43,auVar44);
        auVar35 = vmaxss_avx(auVar37,auVar35);
      }
      bVar30 = auVar79._0_4_ != fVar189;
      auVar37 = vminss_avx512f(auVar43,auVar45);
      auVar82._16_16_ = auVar69._16_16_;
      auVar82._0_16_ = auVar43;
      auVar81._4_28_ = auVar82._4_28_;
      auVar81._0_4_ = (uint)bVar30 * auVar37._0_4_ + (uint)!bVar30 * auVar43._0_4_;
      auVar37 = vmaxss_avx512f(auVar45,auVar35);
      auVar84._16_16_ = auVar69._16_16_;
      auVar84._0_16_ = auVar35;
      auVar83._4_28_ = auVar84._4_28_;
      auVar83._0_4_ = (uint)bVar30 * auVar37._0_4_ + (uint)!bVar30 * auVar35._0_4_;
      auVar35 = vmaxss_avx512f(auVar38,auVar81._0_16_);
      auVar69._0_16_ = vminss_avx512f(auVar83._0_16_,auVar45);
    } while (auVar69._0_4_ < auVar35._0_4_);
    auVar43 = vmaxss_avx512f(auVar38,ZEXT416((uint)(auVar35._0_4_ + -0.1)));
    auVar41 = vminss_avx512f(ZEXT416((uint)(auVar69._0_4_ + 0.1)),auVar45);
    auVar117._0_8_ = auVar86._0_8_;
    auVar117._8_8_ = auVar117._0_8_;
    auVar193._8_8_ = auVar159._0_8_;
    auVar193._0_8_ = auVar159._0_8_;
    auVar212._8_8_ = auVar39._0_8_;
    auVar212._0_8_ = auVar39._0_8_;
    auVar35 = vshufpd_avx(auVar159,auVar159,3);
    auVar37 = vshufpd_avx(auVar39,auVar39,3);
    auVar44 = vshufps_avx(auVar43,auVar41,0);
    auVar39 = vsubps_avx512vl(auVar36,auVar44);
    fVar189 = auVar44._0_4_;
    auVar150._0_4_ = fVar189 * auVar49._0_4_;
    fVar201 = auVar44._4_4_;
    auVar150._4_4_ = fVar201 * auVar49._4_4_;
    fVar203 = auVar44._8_4_;
    auVar150._8_4_ = fVar203 * auVar49._8_4_;
    fVar205 = auVar44._12_4_;
    auVar150._12_4_ = fVar205 * auVar49._12_4_;
    auVar160._0_4_ = fVar189 * auVar35._0_4_;
    auVar160._4_4_ = fVar201 * auVar35._4_4_;
    auVar160._8_4_ = fVar203 * auVar35._8_4_;
    auVar160._12_4_ = fVar205 * auVar35._12_4_;
    auVar231._0_4_ = auVar37._0_4_ * fVar189;
    auVar231._4_4_ = auVar37._4_4_ * fVar201;
    auVar231._8_4_ = auVar37._8_4_ * fVar203;
    auVar231._12_4_ = auVar37._12_4_ * fVar205;
    auVar142._0_4_ = fVar189 * auVar40._0_4_;
    auVar142._4_4_ = fVar201 * auVar40._4_4_;
    auVar142._8_4_ = fVar203 * auVar40._8_4_;
    auVar142._12_4_ = fVar205 * auVar40._12_4_;
    auVar49 = vfmadd231ps_fma(auVar150,auVar39,auVar117);
    auVar40 = vfmadd231ps_fma(auVar160,auVar39,auVar193);
    auVar48 = vfmadd231ps_fma(auVar231,auVar39,auVar212);
    auVar39 = vfmadd231ps_fma(auVar142,auVar39,ZEXT816(0));
    auVar37 = vsubss_avx512f(auVar45,auVar43);
    auVar35 = vmovshdup_avx(auVar98);
    auVar86 = vfmadd231ss_fma(ZEXT416((uint)(auVar35._0_4_ * auVar43._0_4_)),auVar98,auVar37);
    auVar37 = vsubss_avx512f(auVar45,auVar41);
    auVar46 = vfmadd231ss_fma(ZEXT416((uint)(auVar35._0_4_ * auVar41._0_4_)),auVar98,auVar37);
    auVar41 = vdivss_avx512f(auVar45,ZEXT416((uint)fVar208));
    auVar35 = vsubps_avx(auVar40,auVar49);
    auVar42 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
    auVar44 = vmulps_avx512vl(auVar35,auVar42);
    auVar35 = vsubps_avx(auVar48,auVar40);
    auVar43 = vmulps_avx512vl(auVar35,auVar42);
    auVar35 = vsubps_avx(auVar39,auVar48);
    auVar35 = vmulps_avx512vl(auVar35,auVar42);
    auVar37 = vminps_avx(auVar43,auVar35);
    auVar35 = vmaxps_avx(auVar43,auVar35);
    auVar37 = vminps_avx(auVar44,auVar37);
    auVar35 = vmaxps_avx(auVar44,auVar35);
    auVar44 = vshufpd_avx(auVar37,auVar37,3);
    auVar43 = vshufpd_avx(auVar35,auVar35,3);
    auVar37 = vminps_avx(auVar37,auVar44);
    auVar35 = vmaxps_avx(auVar35,auVar43);
    fVar208 = auVar41._0_4_;
    auVar178._0_4_ = auVar37._0_4_ * fVar208;
    auVar178._4_4_ = auVar37._4_4_ * fVar208;
    auVar178._8_4_ = auVar37._8_4_ * fVar208;
    auVar178._12_4_ = auVar37._12_4_ * fVar208;
    auVar168._0_4_ = fVar208 * auVar35._0_4_;
    auVar168._4_4_ = fVar208 * auVar35._4_4_;
    auVar168._8_4_ = fVar208 * auVar35._8_4_;
    auVar168._12_4_ = fVar208 * auVar35._12_4_;
    auVar41 = vdivss_avx512f(auVar45,ZEXT416((uint)(auVar46._0_4_ - auVar86._0_4_)));
    auVar35 = vshufpd_avx(auVar49,auVar49,3);
    auVar37 = vshufpd_avx(auVar40,auVar40,3);
    auVar44 = vshufpd_avx(auVar48,auVar48,3);
    auVar45 = vshufpd_avx(auVar39,auVar39,3);
    auVar35 = vsubps_avx(auVar35,auVar49);
    auVar43 = vsubps_avx(auVar37,auVar40);
    auVar49 = vsubps_avx(auVar44,auVar48);
    auVar45 = vsubps_avx(auVar45,auVar39);
    auVar37 = vminps_avx(auVar35,auVar43);
    auVar35 = vmaxps_avx(auVar35,auVar43);
    auVar44 = vminps_avx(auVar49,auVar45);
    auVar44 = vminps_avx(auVar37,auVar44);
    auVar37 = vmaxps_avx(auVar49,auVar45);
    auVar35 = vmaxps_avx(auVar35,auVar37);
    fVar208 = auVar41._0_4_;
    auVar213._0_4_ = fVar208 * auVar44._0_4_;
    auVar213._4_4_ = fVar208 * auVar44._4_4_;
    auVar213._8_4_ = fVar208 * auVar44._8_4_;
    auVar213._12_4_ = fVar208 * auVar44._12_4_;
    auVar194._0_4_ = fVar208 * auVar35._0_4_;
    auVar194._4_4_ = fVar208 * auVar35._4_4_;
    auVar194._8_4_ = fVar208 * auVar35._8_4_;
    auVar194._12_4_ = fVar208 * auVar35._12_4_;
    auVar45 = vinsertps_avx(auVar34,auVar86,0x10);
    auVar47 = vpermt2ps_avx512vl(auVar34,_DAT_01fb9f90,auVar46);
    auVar99._0_4_ = auVar45._0_4_ + auVar47._0_4_;
    auVar99._4_4_ = auVar45._4_4_ + auVar47._4_4_;
    auVar99._8_4_ = auVar45._8_4_ + auVar47._8_4_;
    auVar99._12_4_ = auVar45._12_4_ + auVar47._12_4_;
    auVar14._8_4_ = 0x3f000000;
    auVar14._0_8_ = 0x3f0000003f000000;
    auVar14._12_4_ = 0x3f000000;
    auVar39 = vmulps_avx512vl(auVar99,auVar14);
    auVar37 = vshufps_avx(auVar39,auVar39,0x54);
    uVar85 = auVar39._0_4_;
    auVar108._4_4_ = uVar85;
    auVar108._0_4_ = uVar85;
    auVar108._8_4_ = uVar85;
    auVar108._12_4_ = uVar85;
    auVar49 = vfmadd213ps_avx512vl(local_c8,auVar108,local_2f8);
    auVar44 = vfmadd213ps_fma(local_d8,auVar108,local_258);
    auVar43 = vfmadd213ps_fma(local_e8,auVar108,local_268);
    auVar35 = vsubps_avx(auVar44,auVar49);
    auVar49 = vfmadd213ps_fma(auVar35,auVar108,auVar49);
    auVar35 = vsubps_avx(auVar43,auVar44);
    auVar35 = vfmadd213ps_fma(auVar35,auVar108,auVar44);
    auVar35 = vsubps_avx(auVar35,auVar49);
    auVar44 = vfmadd231ps_fma(auVar49,auVar35,auVar108);
    auVar40 = vmulps_avx512vl(auVar35,auVar42);
    auVar222._8_8_ = auVar44._0_8_;
    auVar222._0_8_ = auVar44._0_8_;
    auVar35 = vshufpd_avx(auVar44,auVar44,3);
    auVar44 = vshufps_avx(auVar39,auVar39,0x55);
    auVar43 = vsubps_avx(auVar35,auVar222);
    auVar49 = vfmadd231ps_fma(auVar222,auVar44,auVar43);
    auVar232._8_8_ = auVar40._0_8_;
    auVar232._0_8_ = auVar40._0_8_;
    auVar35 = vshufpd_avx(auVar40,auVar40,3);
    auVar35 = vsubps_avx512vl(auVar35,auVar232);
    auVar35 = vfmadd213ps_avx512vl(auVar35,auVar44,auVar232);
    auVar44 = vxorps_avx512vl(auVar43,auVar241._0_16_);
    auVar40 = vmovshdup_avx512vl(auVar35);
    auVar48 = vxorps_avx512vl(auVar40,auVar241._0_16_);
    auVar41 = vmovshdup_avx512vl(auVar43);
    auVar48 = vpermt2ps_avx512vl(auVar48,ZEXT416(5),auVar43);
    auVar242 = ZEXT1664(local_2f8);
    auVar43 = vfmsub231ss_avx512f(ZEXT416((uint)(auVar40._0_4_ * auVar43._0_4_)),auVar35,auVar41);
    auVar44 = vpermt2ps_avx512vl(auVar35,SUB6416(ZEXT464(4),0),auVar44);
    auVar143._0_4_ = auVar43._0_4_;
    auVar143._4_4_ = auVar143._0_4_;
    auVar143._8_4_ = auVar143._0_4_;
    auVar143._12_4_ = auVar143._0_4_;
    auVar35 = vdivps_avx(auVar48,auVar143);
    auVar50 = vdivps_avx512vl(auVar44,auVar143);
    fVar208 = auVar49._0_4_;
    auVar44 = vshufps_avx(auVar49,auVar49,0x55);
    auVar223._0_4_ = fVar208 * auVar35._0_4_ + auVar44._0_4_ * auVar50._0_4_;
    auVar223._4_4_ = fVar208 * auVar35._4_4_ + auVar44._4_4_ * auVar50._4_4_;
    auVar223._8_4_ = fVar208 * auVar35._8_4_ + auVar44._8_4_ * auVar50._8_4_;
    auVar223._12_4_ = fVar208 * auVar35._12_4_ + auVar44._12_4_ * auVar50._12_4_;
    auVar41 = vsubps_avx(auVar37,auVar223);
    auVar44 = vmovshdup_avx(auVar35);
    auVar37 = vinsertps_avx(auVar178,auVar213,0x1c);
    auVar233._0_4_ = auVar44._0_4_ * auVar37._0_4_;
    auVar233._4_4_ = auVar44._4_4_ * auVar37._4_4_;
    auVar233._8_4_ = auVar44._8_4_ * auVar37._8_4_;
    auVar233._12_4_ = auVar44._12_4_ * auVar37._12_4_;
    auVar42 = vinsertps_avx512f(auVar168,auVar194,0x1c);
    auVar44 = vmulps_avx512vl(auVar44,auVar42);
    auVar48 = vminps_avx512vl(auVar233,auVar44);
    auVar49 = vmaxps_avx(auVar44,auVar233);
    auVar40 = vmovshdup_avx(auVar50);
    auVar44 = vinsertps_avx(auVar213,auVar178,0x4c);
    auVar214._0_4_ = auVar40._0_4_ * auVar44._0_4_;
    auVar214._4_4_ = auVar40._4_4_ * auVar44._4_4_;
    auVar214._8_4_ = auVar40._8_4_ * auVar44._8_4_;
    auVar214._12_4_ = auVar40._12_4_ * auVar44._12_4_;
    auVar43 = vinsertps_avx(auVar194,auVar168,0x4c);
    auVar195._0_4_ = auVar40._0_4_ * auVar43._0_4_;
    auVar195._4_4_ = auVar40._4_4_ * auVar43._4_4_;
    auVar195._8_4_ = auVar40._8_4_ * auVar43._8_4_;
    auVar195._12_4_ = auVar40._12_4_ * auVar43._12_4_;
    auVar40 = vminps_avx(auVar214,auVar195);
    auVar48 = vaddps_avx512vl(auVar48,auVar40);
    auVar40 = vmaxps_avx(auVar195,auVar214);
    auVar196._0_4_ = auVar49._0_4_ + auVar40._0_4_;
    auVar196._4_4_ = auVar49._4_4_ + auVar40._4_4_;
    auVar196._8_4_ = auVar49._8_4_ + auVar40._8_4_;
    auVar196._12_4_ = auVar49._12_4_ + auVar40._12_4_;
    auVar215._8_8_ = 0x3f80000000000000;
    auVar215._0_8_ = 0x3f80000000000000;
    auVar49 = vsubps_avx(auVar215,auVar196);
    auVar40 = vsubps_avx(auVar215,auVar48);
    auVar48 = vsubps_avx(auVar45,auVar39);
    auVar39 = vsubps_avx(auVar47,auVar39);
    fVar205 = auVar48._0_4_;
    auVar234._0_4_ = fVar205 * auVar49._0_4_;
    fVar206 = auVar48._4_4_;
    auVar234._4_4_ = fVar206 * auVar49._4_4_;
    fVar207 = auVar48._8_4_;
    auVar234._8_4_ = fVar207 * auVar49._8_4_;
    fVar100 = auVar48._12_4_;
    auVar234._12_4_ = fVar100 * auVar49._12_4_;
    auVar51 = vbroadcastss_avx512vl(auVar35);
    auVar37 = vmulps_avx512vl(auVar51,auVar37);
    auVar42 = vmulps_avx512vl(auVar51,auVar42);
    auVar51 = vminps_avx512vl(auVar37,auVar42);
    auVar42 = vmaxps_avx512vl(auVar42,auVar37);
    auVar37 = vbroadcastss_avx512vl(auVar50);
    auVar44 = vmulps_avx512vl(auVar37,auVar44);
    auVar37 = vmulps_avx512vl(auVar37,auVar43);
    auVar43 = vminps_avx512vl(auVar44,auVar37);
    auVar43 = vaddps_avx512vl(auVar51,auVar43);
    auVar48 = vmulps_avx512vl(auVar48,auVar40);
    in_ZMM17 = ZEXT1664(auVar48);
    fVar208 = auVar39._0_4_;
    auVar197._0_4_ = fVar208 * auVar49._0_4_;
    fVar189 = auVar39._4_4_;
    auVar197._4_4_ = fVar189 * auVar49._4_4_;
    fVar201 = auVar39._8_4_;
    auVar197._8_4_ = fVar201 * auVar49._8_4_;
    fVar203 = auVar39._12_4_;
    auVar197._12_4_ = fVar203 * auVar49._12_4_;
    auVar216._0_4_ = fVar208 * auVar40._0_4_;
    auVar216._4_4_ = fVar189 * auVar40._4_4_;
    auVar216._8_4_ = fVar201 * auVar40._8_4_;
    auVar216._12_4_ = fVar203 * auVar40._12_4_;
    auVar37 = vmaxps_avx(auVar37,auVar44);
    auVar169._0_4_ = auVar42._0_4_ + auVar37._0_4_;
    auVar169._4_4_ = auVar42._4_4_ + auVar37._4_4_;
    auVar169._8_4_ = auVar42._8_4_ + auVar37._8_4_;
    auVar169._12_4_ = auVar42._12_4_ + auVar37._12_4_;
    auVar179._8_8_ = 0x3f800000;
    auVar179._0_8_ = 0x3f800000;
    auVar37 = vsubps_avx(auVar179,auVar169);
    auVar44 = vsubps_avx512vl(auVar179,auVar43);
    auVar228._0_4_ = fVar205 * auVar37._0_4_;
    auVar228._4_4_ = fVar206 * auVar37._4_4_;
    auVar228._8_4_ = fVar207 * auVar37._8_4_;
    auVar228._12_4_ = fVar100 * auVar37._12_4_;
    auVar224._0_4_ = fVar205 * auVar44._0_4_;
    auVar224._4_4_ = fVar206 * auVar44._4_4_;
    auVar224._8_4_ = fVar207 * auVar44._8_4_;
    auVar224._12_4_ = fVar100 * auVar44._12_4_;
    auVar170._0_4_ = fVar208 * auVar37._0_4_;
    auVar170._4_4_ = fVar189 * auVar37._4_4_;
    auVar170._8_4_ = fVar201 * auVar37._8_4_;
    auVar170._12_4_ = fVar203 * auVar37._12_4_;
    auVar180._0_4_ = fVar208 * auVar44._0_4_;
    auVar180._4_4_ = fVar189 * auVar44._4_4_;
    auVar180._8_4_ = fVar201 * auVar44._8_4_;
    auVar180._12_4_ = fVar203 * auVar44._12_4_;
    auVar37 = vminps_avx(auVar228,auVar224);
    auVar44 = vminps_avx512vl(auVar170,auVar180);
    auVar43 = vminps_avx512vl(auVar37,auVar44);
    auVar37 = vmaxps_avx(auVar224,auVar228);
    auVar44 = vmaxps_avx(auVar180,auVar170);
    auVar44 = vmaxps_avx(auVar44,auVar37);
    auVar49 = vminps_avx512vl(auVar234,auVar48);
    auVar37 = vminps_avx(auVar197,auVar216);
    auVar37 = vminps_avx(auVar49,auVar37);
    auVar37 = vhaddps_avx(auVar43,auVar37);
    auVar69._0_16_ = vmaxps_avx512vl(auVar48,auVar234);
    auVar43 = vmaxps_avx(auVar216,auVar197);
    auVar43 = vmaxps_avx(auVar43,auVar69._0_16_);
    auVar44 = vhaddps_avx(auVar44,auVar43);
    auVar37 = vshufps_avx(auVar37,auVar37,0xe8);
    auVar44 = vshufps_avx(auVar44,auVar44,0xe8);
    auVar171._0_4_ = auVar37._0_4_ + auVar41._0_4_;
    auVar171._4_4_ = auVar37._4_4_ + auVar41._4_4_;
    auVar171._8_4_ = auVar37._8_4_ + auVar41._8_4_;
    auVar171._12_4_ = auVar37._12_4_ + auVar41._12_4_;
    auVar181._0_4_ = auVar44._0_4_ + auVar41._0_4_;
    auVar181._4_4_ = auVar44._4_4_ + auVar41._4_4_;
    auVar181._8_4_ = auVar44._8_4_ + auVar41._8_4_;
    auVar181._12_4_ = auVar44._12_4_ + auVar41._12_4_;
    auVar37 = vmaxps_avx(auVar45,auVar171);
    auVar44 = vminps_avx(auVar181,auVar47);
    uVar28 = vcmpps_avx512vl(auVar44,auVar37,1);
  } while ((uVar28 & 3) != 0);
  uVar28 = vcmpps_avx512vl(auVar181,auVar47,1);
  uVar10 = vcmpps_avx512vl(auVar34,auVar171,1);
  if (((ushort)uVar10 & (ushort)uVar28 & 1) == 0) {
    bVar20 = 0;
  }
  else {
    auVar37 = vmovshdup_avx(auVar171);
    bVar20 = auVar86._0_4_ < auVar37._0_4_ & (byte)(uVar28 >> 1) & 0x7f;
  }
  if (((!bVar29 || uVar5 != 0 && !bVar31) | bVar20) != 1) goto LAB_0180ef84;
  lVar24 = 0xc9;
  do {
    lVar24 = lVar24 + -1;
    if (lVar24 == 0) goto LAB_0180e115;
    fVar203 = auVar41._0_4_;
    fVar201 = 1.0 - fVar203;
    fVar208 = fVar201 * fVar201 * fVar201;
    fVar189 = fVar203 * 3.0 * fVar201 * fVar201;
    fVar201 = fVar201 * fVar203 * fVar203 * 3.0;
    auVar129._4_4_ = fVar208;
    auVar129._0_4_ = fVar208;
    auVar129._8_4_ = fVar208;
    auVar129._12_4_ = fVar208;
    auVar118._4_4_ = fVar189;
    auVar118._0_4_ = fVar189;
    auVar118._8_4_ = fVar189;
    auVar118._12_4_ = fVar189;
    auVar92._4_4_ = fVar201;
    auVar92._0_4_ = fVar201;
    auVar92._8_4_ = fVar201;
    auVar92._12_4_ = fVar201;
    fVar203 = fVar203 * fVar203 * fVar203;
    auVar151._0_4_ = (float)local_f8._0_4_ * fVar203;
    auVar151._4_4_ = (float)local_f8._4_4_ * fVar203;
    auVar151._8_4_ = fStack_f0 * fVar203;
    auVar151._12_4_ = fStack_ec * fVar203;
    auVar34 = vfmadd231ps_fma(auVar151,local_268,auVar92);
    auVar34 = vfmadd231ps_fma(auVar34,local_258,auVar118);
    auVar34 = vfmadd231ps_avx512vl(auVar34,local_2f8,auVar129);
    auVar93._8_8_ = auVar34._0_8_;
    auVar93._0_8_ = auVar34._0_8_;
    auVar34 = vshufpd_avx(auVar34,auVar34,3);
    auVar37 = vshufps_avx(auVar41,auVar41,0x55);
    auVar34 = vsubps_avx(auVar34,auVar93);
    auVar37 = vfmadd213ps_fma(auVar34,auVar37,auVar93);
    fVar208 = auVar37._0_4_;
    auVar34 = vshufps_avx(auVar37,auVar37,0x55);
    auVar94._0_4_ = auVar35._0_4_ * fVar208 + auVar50._0_4_ * auVar34._0_4_;
    auVar94._4_4_ = auVar35._4_4_ * fVar208 + auVar50._4_4_ * auVar34._4_4_;
    auVar94._8_4_ = auVar35._8_4_ * fVar208 + auVar50._8_4_ * auVar34._8_4_;
    auVar94._12_4_ = auVar35._12_4_ * fVar208 + auVar50._12_4_ * auVar34._12_4_;
    auVar41 = vsubps_avx(auVar41,auVar94);
    auVar34 = vandps_avx512vl(auVar37,auVar238._0_16_);
    auVar69._0_16_ = vprolq_avx512vl(auVar34,0x20);
    auVar34 = vmaxss_avx(auVar69._0_16_,auVar34);
  } while ((float)local_108._0_4_ <= auVar34._0_4_);
  auVar35 = vucomiss_avx512f(auVar38);
  if ((float)local_108._0_4_ < auVar34._0_4_) goto LAB_0180e115;
  fVar208 = auVar35._0_4_;
  if (1.0 < fVar208) goto LAB_0180e115;
  vmovshdup_avx(auVar35);
  auVar34 = vucomiss_avx512f(auVar38);
  if ((1.0 < fVar208) || (fVar189 = auVar34._0_4_, 1.0 < fVar189)) goto LAB_0180e115;
  auVar34 = vinsertps_avx(ZEXT416((uint)(pre->ray_space).vx.field_0.m128[2]),
                          ZEXT416((uint)(pre->ray_space).vy.field_0.m128[2]),0x1c);
  auVar48 = vinsertps_avx(auVar34,ZEXT416((uint)(pre->ray_space).vz.field_0.m128[2]),0x28);
  aVar1 = (ray->super_RayK<1>).org.field_0;
  auVar34 = vsubps_avx(local_1a8,(undefined1  [16])aVar1);
  auVar34 = vdpps_avx(auVar34,auVar48,0x7f);
  auVar37 = vsubps_avx(local_1e8,(undefined1  [16])aVar1);
  auVar37 = vdpps_avx(auVar37,auVar48,0x7f);
  auVar44 = vsubps_avx(local_1f8,(undefined1  [16])aVar1);
  auVar44 = vdpps_avx(auVar44,auVar48,0x7f);
  auVar45 = vsubps_avx(local_1c8,(undefined1  [16])aVar1);
  auVar45 = vdpps_avx(auVar45,auVar48,0x7f);
  auVar43 = vsubps_avx(_local_1b8,(undefined1  [16])aVar1);
  auVar43 = vdpps_avx(auVar43,auVar48,0x7f);
  auVar49 = vsubps_avx(_local_208,(undefined1  [16])aVar1);
  auVar49 = vdpps_avx(auVar49,auVar48,0x7f);
  auVar40 = vsubps_avx(_local_218,(undefined1  [16])aVar1);
  auVar40 = vdpps_avx(auVar40,auVar48,0x7f);
  auVar38 = vsubps_avx(_local_1d8,(undefined1  [16])aVar1);
  auVar48 = vdpps_avx(auVar38,auVar48,0x7f);
  fVar201 = 1.0 - fVar189;
  auVar34 = vfmadd231ss_fma(ZEXT416((uint)(auVar43._0_4_ * fVar189)),ZEXT416((uint)fVar201),auVar34)
  ;
  auVar37 = vfmadd231ss_fma(ZEXT416((uint)(auVar49._0_4_ * fVar189)),ZEXT416((uint)fVar201),auVar37)
  ;
  auVar44 = vfmadd231ss_fma(ZEXT416((uint)(auVar40._0_4_ * fVar189)),ZEXT416((uint)fVar201),auVar44)
  ;
  auVar45 = vfmadd231ss_fma(ZEXT416((uint)(fVar189 * auVar48._0_4_)),ZEXT416((uint)fVar201),auVar45)
  ;
  fVar205 = 1.0 - fVar208;
  fVar189 = fVar205 * fVar205 * fVar205;
  fVar201 = fVar208 * 3.0 * fVar205 * fVar205;
  fVar203 = fVar205 * fVar208 * fVar208 * 3.0;
  fVar207 = fVar208 * fVar208 * fVar208;
  auVar44 = vfmadd231ss_fma(ZEXT416((uint)(fVar207 * auVar45._0_4_)),ZEXT416((uint)fVar203),auVar44)
  ;
  auVar37 = vfmadd231ss_fma(auVar44,ZEXT416((uint)fVar201),auVar37);
  auVar34 = vfmadd231ss_fma(auVar37,ZEXT416((uint)fVar189),auVar34);
  fVar206 = auVar34._0_4_;
  if ((fVar206 < (ray->super_RayK<1>).org.field_0.m128[3]) ||
     (fVar100 = (ray->super_RayK<1>).tfar, fVar100 < fVar206)) goto LAB_0180e115;
  auVar34 = vshufps_avx(auVar35,auVar35,0x55);
  auVar44 = vsubps_avx512vl(auVar36,auVar34);
  fVar112 = auVar34._0_4_;
  auVar182._0_4_ = fVar112 * (float)local_1b8._0_4_;
  fVar120 = auVar34._4_4_;
  auVar182._4_4_ = fVar120 * (float)local_1b8._4_4_;
  fVar121 = auVar34._8_4_;
  auVar182._8_4_ = fVar121 * fStack_1b0;
  fVar122 = auVar34._12_4_;
  auVar182._12_4_ = fVar122 * fStack_1ac;
  auVar186._0_4_ = fVar112 * (float)local_208._0_4_;
  auVar186._4_4_ = fVar120 * (float)local_208._4_4_;
  auVar186._8_4_ = fVar121 * fStack_200;
  auVar186._12_4_ = fVar122 * fStack_1fc;
  auVar198._0_4_ = fVar112 * (float)local_218._0_4_;
  auVar198._4_4_ = fVar120 * (float)local_218._4_4_;
  auVar198._8_4_ = fVar121 * fStack_210;
  auVar198._12_4_ = fVar122 * fStack_20c;
  auVar161._0_4_ = fVar112 * (float)local_1d8._0_4_;
  auVar161._4_4_ = fVar120 * (float)local_1d8._4_4_;
  auVar161._8_4_ = fVar121 * fStack_1d0;
  auVar161._12_4_ = fVar122 * fStack_1cc;
  auVar34 = vfmadd231ps_fma(auVar182,auVar44,local_1a8);
  auVar36 = vfmadd231ps_fma(auVar186,auVar44,local_1e8);
  auVar37 = vfmadd231ps_fma(auVar198,auVar44,local_1f8);
  auVar44 = vfmadd231ps_fma(auVar161,auVar44,local_1c8);
  auVar34 = vsubps_avx(auVar36,auVar34);
  auVar36 = vsubps_avx(auVar37,auVar36);
  auVar37 = vsubps_avx(auVar44,auVar37);
  auVar199._0_4_ = fVar208 * auVar36._0_4_;
  auVar199._4_4_ = fVar208 * auVar36._4_4_;
  auVar199._8_4_ = fVar208 * auVar36._8_4_;
  auVar199._12_4_ = fVar208 * auVar36._12_4_;
  auVar152._4_4_ = fVar205;
  auVar152._0_4_ = fVar205;
  auVar152._8_4_ = fVar205;
  auVar152._12_4_ = fVar205;
  auVar34 = vfmadd231ps_fma(auVar199,auVar152,auVar34);
  auVar162._0_4_ = fVar208 * auVar37._0_4_;
  auVar162._4_4_ = fVar208 * auVar37._4_4_;
  auVar162._8_4_ = fVar208 * auVar37._8_4_;
  auVar162._12_4_ = fVar208 * auVar37._12_4_;
  auVar36 = vfmadd231ps_fma(auVar162,auVar152,auVar36);
  auVar163._0_4_ = fVar208 * auVar36._0_4_;
  auVar163._4_4_ = fVar208 * auVar36._4_4_;
  auVar163._8_4_ = fVar208 * auVar36._8_4_;
  auVar163._12_4_ = fVar208 * auVar36._12_4_;
  auVar34 = vfmadd231ps_fma(auVar163,auVar152,auVar34);
  auVar15._8_4_ = 0x40400000;
  auVar15._0_8_ = 0x4040000040400000;
  auVar15._12_4_ = 0x40400000;
  auVar69._0_16_ = vmulps_avx512vl(auVar34,auVar15);
  pGVar6 = (context->scene->geometries).items[uVar4].ptr;
  if ((pGVar6->mask & (ray->super_RayK<1>).mask) == 0) goto LAB_0180e115;
  auVar144._0_4_ = fVar207 * (float)local_148._0_4_;
  auVar144._4_4_ = fVar207 * (float)local_148._4_4_;
  auVar144._8_4_ = fVar207 * fStack_140;
  auVar144._12_4_ = fVar207 * fStack_13c;
  auVar130._4_4_ = fVar203;
  auVar130._0_4_ = fVar203;
  auVar130._8_4_ = fVar203;
  auVar130._12_4_ = fVar203;
  auVar34 = vfmadd132ps_fma(auVar130,auVar144,local_138);
  auVar119._4_4_ = fVar201;
  auVar119._0_4_ = fVar201;
  auVar119._8_4_ = fVar201;
  auVar119._12_4_ = fVar201;
  auVar34 = vfmadd132ps_fma(auVar119,auVar34,local_128);
  auVar109._4_4_ = fVar189;
  auVar109._0_4_ = fVar189;
  auVar109._8_4_ = fVar189;
  auVar109._12_4_ = fVar189;
  auVar37 = vfmadd132ps_fma(auVar109,auVar34,local_118);
  auVar34 = vshufps_avx(auVar37,auVar37,0xc9);
  auVar36 = vshufps_avx(auVar69._0_16_,auVar69._0_16_,0xc9);
  auVar110._0_4_ = auVar37._0_4_ * auVar36._0_4_;
  auVar110._4_4_ = auVar37._4_4_ * auVar36._4_4_;
  auVar110._8_4_ = auVar37._8_4_ * auVar36._8_4_;
  auVar110._12_4_ = auVar37._12_4_ * auVar36._12_4_;
  auVar36 = vfmsub231ps_fma(auVar110,auVar69._0_16_,auVar34);
  auVar34 = vshufps_avx(auVar36,auVar36,0xe9);
  if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
     (pGVar6->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
    (ray->super_RayK<1>).tfar = fVar206;
    uVar10 = vmovlps_avx(auVar34);
    *(undefined8 *)&(ray->Ng).field_0 = uVar10;
    (ray->Ng).field_0.field_0.z = auVar36._0_4_;
    uVar10 = vmovlps_avx(auVar35);
    ray->u = (float)(int)uVar10;
    ray->v = (float)(int)((ulong)uVar10 >> 0x20);
    ray->primID = (uint)local_300;
    ray->geomID = uVar4;
    ray->instID[0] = context->user->instID[0];
    ray->instPrimID[0] = context->user->instPrimID[0];
    goto LAB_0180e115;
  }
  local_188 = vmovlps_avx(auVar34);
  local_180 = auVar36._0_4_;
  local_17c = vmovlps_avx(auVar35);
  local_174 = (uint)local_300;
  local_170 = uVar4;
  local_16c = context->user->instID[0];
  local_168 = context->user->instPrimID[0];
  (ray->super_RayK<1>).tfar = fVar206;
  local_304 = -1;
  local_248.valid = &local_304;
  local_248.geometryUserPtr = pGVar6->userPtr;
  local_248.context = context->user;
  local_248.ray = (RTCRayN *)ray;
  local_248.hit = (RTCHitN *)&local_188;
  local_248.N = 1;
  if (pGVar6->intersectionFilterN != (RTCFilterFunctionN)0x0) {
    (*pGVar6->intersectionFilterN)(&local_248);
    auVar237 = ZEXT3264(_DAT_01fb9fe0);
    auVar34 = vbroadcastss_avx512vl(ZEXT416(0x3e124925));
    auVar236 = ZEXT1664(auVar34);
    auVar69 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
    auVar235 = ZEXT3264(auVar69);
    auVar34 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
    auVar241 = ZEXT1664(auVar34);
    auVar34 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
    auVar239 = ZEXT1664(auVar34);
    auVar69._0_16_ = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
    auVar238 = ZEXT1664(auVar69._0_16_);
    if (*local_248.valid == 0) goto LAB_0180ef73;
  }
  p_Var7 = context->args->filter;
  if ((p_Var7 != (RTCFilterFunctionN)0x0) &&
     (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
       RTC_RAY_QUERY_FLAG_INCOHERENT || (((pGVar6->field_8).field_0x2 & 0x40) != 0)))) {
    (*p_Var7)(&local_248);
    auVar237 = ZEXT3264(_DAT_01fb9fe0);
    auVar34 = vbroadcastss_avx512vl(ZEXT416(0x3e124925));
    auVar236 = ZEXT1664(auVar34);
    auVar69 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
    auVar235 = ZEXT3264(auVar69);
    auVar34 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
    auVar241 = ZEXT1664(auVar34);
    auVar34 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
    auVar239 = ZEXT1664(auVar34);
    auVar69._0_16_ = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
    auVar238 = ZEXT1664(auVar69._0_16_);
    if (*local_248.valid == 0) {
LAB_0180ef73:
      (ray->super_RayK<1>).tfar = fVar100;
      goto LAB_0180e115;
    }
  }
  (((Vec3f *)((long)local_248.ray + 0x30))->field_0).components[0] = *(float *)local_248.hit;
  (((Vec3f *)((long)local_248.ray + 0x30))->field_0).field_0.y = *(float *)(local_248.hit + 4);
  (((Vec3f *)((long)local_248.ray + 0x30))->field_0).field_0.z = *(float *)(local_248.hit + 8);
  *(float *)((long)local_248.ray + 0x3c) = *(float *)(local_248.hit + 0xc);
  *(float *)((long)local_248.ray + 0x40) = *(float *)(local_248.hit + 0x10);
  *(float *)((long)local_248.ray + 0x44) = *(float *)(local_248.hit + 0x14);
  *(float *)((long)local_248.ray + 0x48) = *(float *)(local_248.hit + 0x18);
  *(float *)((long)local_248.ray + 0x4c) = *(float *)(local_248.hit + 0x1c);
  *(float *)((long)local_248.ray + 0x50) = *(float *)(local_248.hit + 0x20);
  goto LAB_0180e115;
LAB_0180ef84:
  auVar98 = vinsertps_avx(auVar86,auVar46,0x10);
  goto LAB_0180dbbb;
}

Assistant:

static __forceinline void intersect_n(const Precalculations& pre, RayHit& ray, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(normal.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          
          unsigned int vertexID = geom->curve(primID);
          Vec3ff a0,a1,a2,a3; Vec3fa n0,n1,n2,n3; geom->gather(a0,a1,a2,a3,n0,n1,n2,n3,vertexID);

          size_t mask1 = mask;
          const size_t i1 = bscf(mask1);
          if (mask) {
            const unsigned int primID1 = prim.primID(N)[i1];
            geom->prefetchL1_vertices(geom->curve(primID1));
            if (mask1) {
              const size_t i2 = bsf(mask1);
              const unsigned int primID2 = prim.primID(N)[i2];
              geom->prefetchL2_vertices(geom->curve(primID2));
            }
          }
          
          Intersector().intersect(pre,ray,context,geom,primID,a0,a1,a2,a3,n0,n1,n2,n3,Epilog(ray,context,geomID,primID));
          mask &= movemask(tNear <= vfloat<M>(ray.tfar));
        }
      }